

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_modinv32_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  int64_t *piVar1;
  uint *puVar2;
  ulong *puVar3;
  ushort *puVar4;
  secp256k1_scalar *a;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int64_t iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar17;
  uint64_t uVar18;
  long lVar19;
  ulong uVar20;
  byte bVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  secp256k1_modinv32_signed30 *b;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  secp256k1_modinv64_modinfo *m_00;
  long lVar26;
  secp256k1_modinv32_signed30 *a_00;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar27;
  secp256k1_modinv32_signed30 *b_00;
  long *extraout_RDX_01;
  uint uVar28;
  ulong uVar29;
  code *pcVar30;
  secp256k1_modinv64_modinfo *psVar31;
  int *piVar32;
  secp256k1_modinv32_signed30 *psVar33;
  secp256k1_fe *psVar34;
  uint uVar35;
  uint uVar36;
  ulong unaff_RBP;
  secp256k1_modinv64_modinfo *psVar37;
  uint8_t *puVar38;
  uint uVar39;
  uint uVar40;
  secp256k1_modinv64_modinfo *psVar41;
  secp256k1_modinv64_modinfo *psVar42;
  long lVar43;
  secp256k1_modinv32_signed30 *psVar44;
  secp256k1_fe *psVar45;
  secp256k1_fe *psVar46;
  secp256k1_fe *r;
  secp256k1_modinv64_modinfo *psVar47;
  secp256k1_modinv64_modinfo *psVar48;
  secp256k1_modinv32_signed30 *a_01;
  secp256k1_modinv32_signed30 *a_02;
  long lVar49;
  ulong uVar50;
  secp256k1_fe *r_00;
  uchar *__s;
  ulong uVar51;
  ulong uVar52;
  uint uVar53;
  ulong uVar54;
  secp256k1_modinv64_modinfo *psVar55;
  int *piVar56;
  uint uVar57;
  uint uVar58;
  secp256k1_modinv64_modinfo *psVar59;
  secp256k1_modinv64_modinfo *psVar60;
  secp256k1_modinv32_modinfo *modinfo;
  secp256k1_modinv32_modinfo *psVar61;
  secp256k1_modinv32_signed30 *psVar62;
  uint uVar63;
  code *unaff_R13;
  secp256k1_modinv32_signed30 *psVar64;
  size_t count;
  uint uVar65;
  secp256k1_modinv64_modinfo *psVar66;
  secp256k1_modinv64_modinfo *psVar67;
  code *pcVar68;
  bool bVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  secp256k1_modinv32_signed30 x;
  secp256k1_modinv32_modinfo m;
  uint16_t tmp [16];
  uint16_t negone [16];
  ulong uStack_1830;
  secp256k1_fe *psStack_1828;
  uchar auStack_1820 [4232];
  secp256k1_fe *psStack_798;
  code *pcStack_790;
  undefined8 uStack_788;
  secp256k1_fe *psStack_780;
  code *pcStack_778;
  code *pcStack_770;
  undefined1 auStack_768 [36];
  int iStack_744;
  int iStack_740;
  int iStack_73c;
  int iStack_738;
  int iStack_734;
  int iStack_730;
  int iStack_72c;
  undefined1 auStack_728 [48];
  code *pcStack_6f8;
  secp256k1_fe sStack_6f0;
  secp256k1_fe sStack_6c0;
  secp256k1_fe sStack_690;
  ulong uStack_658;
  ulong uStack_650;
  ulong uStack_648;
  secp256k1_modinv32_signed30 *psStack_640;
  ulong uStack_638;
  code *pcStack_630;
  uint uStack_628;
  uint uStack_624;
  uint uStack_620;
  uint uStack_61c;
  uint uStack_618;
  uint uStack_614;
  secp256k1_modinv32_signed30 *psStack_610;
  uint uStack_604;
  uint uStack_600;
  uint uStack_5fc;
  uint uStack_5f8;
  int32_t iStack_5f4;
  secp256k1_modinv32_signed30 *psStack_5f0;
  secp256k1_modinv32_signed30 *psStack_5e8;
  secp256k1_modinv32_signed30 *psStack_5e0;
  secp256k1_modinv32_signed30 *psStack_5d8;
  secp256k1_modinv32_signed30 *psStack_5d0;
  code *pcStack_5c8;
  long lStack_5b8;
  long lStack_5b0;
  int *piStack_5a8;
  secp256k1_modinv32_modinfo *psStack_5a0;
  ulong uStack_598;
  ulong uStack_588;
  code *pcStack_580;
  secp256k1_modinv32_signed30 *psStack_578;
  int *piStack_568;
  secp256k1_modinv32_modinfo *psStack_560;
  ulong uStack_558;
  ulong uStack_548;
  code *pcStack_540;
  secp256k1_modinv32_signed30 sStack_538;
  secp256k1_modinv32_signed30 sStack_514;
  secp256k1_modinv64_modinfo *psStack_4f0;
  secp256k1_modinv64_modinfo *psStack_4e8;
  secp256k1_modinv32_modinfo *psStack_4d8;
  uint uStack_4cc;
  uint uStack_4c8;
  uint uStack_4c4;
  secp256k1_modinv64_modinfo sStack_4c0;
  secp256k1_modinv32_trans2x2 sStack_490;
  secp256k1_modinv64_modinfo sStack_480;
  secp256k1_modinv64_modinfo *psStack_450;
  long lStack_448;
  secp256k1_modinv64_modinfo sStack_440;
  secp256k1_modinv32_signed30 sStack_410;
  secp256k1_modinv64_modinfo *psStack_3e8;
  secp256k1_modinv32_modinfo *psStack_3e0;
  secp256k1_modinv64_modinfo *psStack_3d8;
  secp256k1_modinv64_modinfo *psStack_3d0;
  secp256k1_modinv64_modinfo *psStack_3c8;
  code *pcStack_3c0;
  uint uStack_3ac;
  secp256k1_modinv32_trans2x2 sStack_3a8;
  secp256k1_modinv64_modinfo sStack_398;
  secp256k1_modinv64_modinfo sStack_368;
  secp256k1_modinv64_modinfo *psStack_338;
  secp256k1_modinv64_modinfo *psStack_330;
  secp256k1_modinv64_modinfo sStack_328;
  secp256k1_modinv32_signed30 sStack_2f8;
  secp256k1_modinv64_modinfo *psStack_2d0;
  secp256k1_modinv64_modinfo *psStack_2c8;
  ulong uStack_2c0;
  secp256k1_modinv64_modinfo *psStack_2b8;
  secp256k1_modinv64_modinfo *psStack_2b0;
  secp256k1_modinv64_modinfo *psStack_2a8;
  int iStack_298;
  int iStack_294;
  secp256k1_modinv32_trans2x2 sStack_290;
  secp256k1_modinv64_modinfo sStack_280;
  secp256k1_modinv64_modinfo sStack_250;
  secp256k1_modinv64_modinfo *psStack_220;
  secp256k1_modinv64_modinfo *psStack_218;
  ulong uStack_210;
  secp256k1_modinv64_modinfo *psStack_208;
  secp256k1_modinv64_modinfo *psStack_200;
  ulong uStack_1f8;
  secp256k1_modinv64_modinfo *psStack_1f0;
  secp256k1_modinv64_modinfo *psStack_1e8;
  code *pcStack_1e0;
  code *pcStack_1d8;
  secp256k1_modinv64_modinfo sStack_1d0;
  secp256k1_modinv64_modinfo sStack_1a0;
  secp256k1_modinv64_modinfo sStack_170;
  uint16_t uStack_140;
  undefined8 uStack_13e;
  undefined6 uStack_136;
  undefined2 uStack_130;
  undefined6 uStack_12e;
  int64_t iStack_128;
  uint16_t *puStack_118;
  ulong uStack_110;
  code *pcStack_108;
  uint16_t *puStack_100;
  uint16_t *puStack_f8;
  code *pcStack_f0;
  secp256k1_modinv64_modinfo local_e8;
  secp256k1_modinv64_modinfo local_b8;
  secp256k1_modinv64_modinfo local_88;
  uint16_t local_58;
  undefined8 local_56;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined6 uStack_46;
  undefined8 uStack_40;
  
  psVar37 = &local_e8;
  psVar67 = &local_e8;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar14 = 0;
  do {
    puVar2 = (uint *)((long)local_e8.modulus.v + ((ulong)uVar14 / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((in[uVar14 >> 4] >> (uVar14 & 0xf) & 1) != 0) <<
                        ((char)(uVar14 / 0x1e) * -0x1e + (char)uVar14 & 0x1fU);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x100);
  uVar57 = local_e8.modulus.v[0]._4_4_ | (uint)local_e8.modulus.v[0] | (uint)local_e8.modulus.v[1] |
           local_e8.modulus.v[1]._4_4_ | (uint)local_e8.modulus.v[2] | local_e8.modulus.v[2]._4_4_ |
           (uint)local_e8.modulus.v[3] | local_e8.modulus.v[3]._4_4_ | (uint)local_e8.modulus.v[4];
  uVar52 = (ulong)uVar57;
  local_b8.modulus.v[0] = 0;
  local_b8.modulus.v[1] = 0;
  local_b8.modulus.v[2] = 0;
  local_b8.modulus.v[3] = 0;
  local_b8.modulus.v[4]._0_4_ = 0;
  uVar14 = 0;
  do {
    psVar41 = (secp256k1_modinv64_modinfo *)((ulong)uVar14 / 0x1e);
    puVar2 = (uint *)((long)local_b8.modulus.v + (long)psVar41 * 4);
    *puVar2 = *puVar2 | (uint)((mod[uVar14 >> 4] >> (uVar14 & 0xf) & 1) != 0) <<
                        ((char)(uVar14 / 0x1e) * -0x1e + (char)uVar14 & 0x1fU);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x100);
  psVar47 = (secp256k1_modinv64_modinfo *)(long)(int)local_b8.modulus.v[0];
  pcStack_f0 = (code *)0x15405a;
  uVar18 = modinv2p64((uint64_t)psVar47);
  local_b8.modulus.v[4]._4_4_ = (uint)uVar18 & 0x3fffffff;
  if (((uint)uVar18 * (int)local_b8.modulus.v[0] & 0x3fffffff) != 1) goto LAB_0015442c;
  if (uVar57 == 0) {
LAB_001541ab:
    local_e8.modulus.v[2] = 0;
    local_e8.modulus.v[3] = 0;
    local_e8.modulus.v[0] = 0;
    local_e8.modulus.v[1] = 0;
    local_e8.modulus.v[4]._0_4_ = 0;
    uVar14 = 0;
    do {
      puVar2 = (uint *)((long)local_e8.modulus.v + ((ulong)uVar14 / 0x1e) * 4);
      *puVar2 = *puVar2 | (uint)((in[uVar14 >> 4] >> (uVar14 & 0xf) & 1) != 0) <<
                          ((char)(uVar14 / 0x1e) * -0x1e + (char)uVar14 & 0x1fU);
      uVar14 = uVar14 + 1;
    } while (uVar14 != 0x100);
    local_88.modulus_inv62 = (uint64_t)mod;
    iVar15 = 0x10;
    do {
      uVar52 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar54 = uVar52 >> 0x1d;
      uVar52 = uVar52 >> 0x3d;
      iVar23 = *(int *)((long)local_b8.modulus.v + uVar52 * 4);
      if (iVar23 < 1) {
LAB_0015427d:
        if (iVar23 < 0) {
          uVar54 = uVar54 + 0x100000000 >> 0x20;
          iVar5 = *(int *)((long)local_b8.modulus.v + uVar54 * 4);
          if (0x3ffffffe < iVar5) {
            *(int *)((long)local_b8.modulus.v + uVar52 * 4) = iVar23 + 0x40000000;
            *(int *)((long)local_b8.modulus.v + uVar54 * 4) = iVar5 + -1;
          }
        }
      }
      else {
        uVar29 = uVar54 + 0x100000000 >> 0x20;
        iVar5 = *(int *)((long)local_b8.modulus.v + uVar29 * 4);
        if (0x3fffffff < iVar5) goto LAB_0015427d;
        *(int *)((long)local_b8.modulus.v + uVar52 * 4) = iVar23 + -0x40000000;
        *(int *)((long)local_b8.modulus.v + uVar29 * 4) = iVar5 + 1;
      }
      uVar29 = secp256k1_test_state[1] << 0x11;
      uVar54 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar52 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar54;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar52;
      secp256k1_test_state[2] = uVar54 ^ uVar29;
      secp256k1_test_state[3] = uVar52 << 0x2d | uVar52 >> 0x13;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    unaff_RBP = (ulong)(uVar57 != 0);
    mod = (uint16_t *)0x0;
    uVar52 = 0x88888889;
    while( true ) {
      iVar15 = (int)mod;
      unaff_R13 = secp256k1_modinv32_var;
      if (iVar15 == 0) {
        unaff_R13 = secp256k1_modinv32;
      }
      pcStack_f0 = (code *)0x154318;
      (*unaff_R13)(&local_e8,&local_b8);
      out[8] = 0;
      out[9] = 0;
      out[10] = 0;
      out[0xb] = 0;
      out[0xc] = 0;
      out[0xd] = 0;
      out[0xe] = 0;
      out[0xf] = 0;
      out[0] = 0;
      out[1] = 0;
      out[2] = 0;
      out[3] = 0;
      out[4] = 0;
      out[5] = 0;
      out[6] = 0;
      out[7] = 0;
      uVar14 = 0;
      do {
        out[uVar14 >> 4] =
             out[uVar14 >> 4] |
             (ushort)((*(uint *)((long)local_e8.modulus.v + ((ulong)uVar14 / 0x1e) * 4) >>
                       uVar14 % 0x1e & 1) != 0) << ((byte)uVar14 & 0xf);
        uVar14 = uVar14 + 1;
      } while (uVar14 != 0x100);
      psVar47 = &local_88;
      pcStack_f0 = (code *)0x154373;
      psVar41 = (secp256k1_modinv64_modinfo *)out;
      mulmod256((uint16_t *)psVar47,out,in,(uint16_t *)local_88.modulus_inv62);
      if ((ushort)local_88.modulus.v[0] != (uVar57 != 0)) break;
      lVar19 = 1;
      do {
        if (*(short *)((long)local_88.modulus.v + lVar19 * 2) != 0) {
          pcStack_f0 = (code *)0x154422;
          test_modinv32_uint16_cold_4();
          goto LAB_00154422;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
      pcStack_f0 = (code *)0x1543a3;
      psVar47 = &local_e8;
      (*unaff_R13)(&local_e8,&local_b8);
      local_88.modulus.v[2] = 0;
      local_88.modulus.v[3] = 0;
      local_88.modulus.v[0] = 0;
      local_88.modulus.v[1] = 0;
      uVar14 = 0;
      do {
        uVar39 = (uint)((*(uint *)((long)local_e8.modulus.v + ((ulong)uVar14 / 0x1e) * 4) >>
                         uVar14 % 0x1e & 1) != 0) << ((byte)uVar14 & 0xf);
        psVar41 = (secp256k1_modinv64_modinfo *)(ulong)uVar39;
        puVar4 = (ushort *)((long)local_88.modulus.v + (ulong)(uVar14 >> 4) * 2);
        *puVar4 = *puVar4 | (ushort)uVar39;
        uVar14 = uVar14 + 1;
      } while (uVar14 != 0x100);
      lVar19 = 0;
      do {
        if (*(uint16_t *)((long)local_88.modulus.v + lVar19 * 2) != in[lVar19]) goto LAB_00154422;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
      mod = (uint16_t *)(ulong)(iVar15 + 1);
      if (iVar15 != 0) {
        return;
      }
    }
    goto LAB_00154427;
  }
  pcStack_f0 = (code *)0x154093;
  mulmod256((uint16_t *)&local_88,in,in,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar14 = 0;
  do {
    puVar2 = (uint *)((long)local_e8.modulus.v + ((ulong)uVar14 / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar14 >> 4) * 2) >>
                                (uVar14 & 0xf) & 1) != 0) <<
                        ((char)(uVar14 / 0x1e) * -0x1e + (char)uVar14 & 0x1fU);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x100);
  psVar41 = &local_b8;
  pcStack_f0 = (code *)0x1540f6;
  uVar14 = secp256k1_jacobi32_maybe_var
                     ((secp256k1_modinv32_signed30 *)&local_e8,(secp256k1_modinv32_modinfo *)psVar41
                     );
  if (1 < uVar14) goto LAB_00154431;
  local_58 = *mod - 1;
  local_56 = *(undefined8 *)(mod + 1);
  uStack_40 = *(undefined8 *)(mod + 0xc);
  uStack_4e = (undefined6)*(undefined8 *)(mod + 5);
  uStack_48 = (undefined2)*(undefined8 *)(mod + 8);
  uStack_46 = (undefined6)((ulong)*(undefined8 *)(mod + 8) >> 0x10);
  pcStack_f0 = (code *)0x15412f;
  mulmod256((uint16_t *)&local_88,(uint16_t *)&local_88,&local_58,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar14 = 0;
  do {
    puVar2 = (uint *)((long)local_e8.modulus.v + ((ulong)uVar14 / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar14 >> 4) * 2) >>
                                (uVar14 & 0xf) & 1) != 0) <<
                        ((char)(uVar14 / 0x1e) * -0x1e + (char)uVar14 & 0x1fU);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x100);
  psVar41 = &local_b8;
  pcStack_f0 = (code *)0x154192;
  iVar15 = secp256k1_jacobi32_maybe_var
                     ((secp256k1_modinv32_signed30 *)&local_e8,(secp256k1_modinv32_modinfo *)psVar41
                     );
  if ((iVar15 == 0) || (iVar15 == 1 - (*mod & 2))) goto LAB_001541ab;
LAB_00154436:
  pcStack_f0 = test_modinv64_uint16;
  test_modinv32_uint16_cold_2();
  pcStack_f0 = (code *)unaff_RBP;
  puStack_f8 = out;
  puStack_100 = in;
  pcStack_108 = unaff_R13;
  uStack_110 = uVar52;
  puStack_118 = mod;
  psVar42 = &sStack_1d0;
  psVar47 = &sStack_1d0;
  sStack_1d0.modulus.v[0] = 0;
  sStack_1d0.modulus.v[1] = 0;
  sStack_1d0.modulus.v[2] = 0;
  sStack_1d0.modulus.v[3] = 0;
  sStack_1d0.modulus.v[4] = 0;
  uVar52 = 0;
  psVar37 = (secp256k1_modinv64_modinfo *)0x8421084210842109;
  do {
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar52 >> 1;
    puVar3 = (ulong *)((long)sStack_1d0.modulus.v +
                      (ulong)((uint)((uVar52 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8))
    ;
    *puVar3 = *puVar3 | (ulong)((*(ushort *)
                                  ((long)(psVar41->modulus).v + (uVar52 >> 4 & 0xfffffff) * 2) >>
                                 ((uint)uVar52 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar74 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar52 & 0x3fU);
    uVar52 = uVar52 + 1;
  } while ((int)uVar52 != 0x100);
  psVar59 = (secp256k1_modinv64_modinfo *)
            (sStack_1d0.modulus.v[1] | sStack_1d0.modulus.v[0] | sStack_1d0.modulus.v[2] |
             sStack_1d0.modulus.v[3] | sStack_1d0.modulus.v[4]);
  sStack_1a0.modulus.v[0] = 0;
  sStack_1a0.modulus.v[1] = 0;
  sStack_1a0.modulus.v[2] = 0;
  sStack_1a0.modulus.v[3] = 0;
  sStack_1a0.modulus.v[4] = 0;
  psVar31 = (secp256k1_modinv64_modinfo *)0x0;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (ulong)psVar31 >> 1;
    puVar3 = (ulong *)((long)sStack_1a0.modulus.v +
                      (ulong)((uint)(((ulong)psVar31 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) &
                             0xfffffff8));
    *puVar3 = *puVar3 | (ulong)((*(ushort *)
                                  ((long)(m_00->modulus).v + ((ulong)psVar31 >> 4 & 0xfffffff) * 2)
                                 >> ((uint)psVar31 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar7 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)psVar31 & 0x3fU);
    psVar31 = (secp256k1_modinv64_modinfo *)((long)(psVar31->modulus).v + 1);
  } while ((int)psVar31 != 0x100);
  uVar52 = 0x3fffffffffffffff;
  pcStack_1d8 = (code *)0x154568;
  psVar48 = (secp256k1_modinv64_modinfo *)sStack_1a0.modulus.v[0];
  uVar18 = modinv2p64(sStack_1a0.modulus.v[0]);
  sStack_1a0.modulus_inv62 = uVar18 & 0x3fffffffffffffff;
  pcVar30 = (code *)m_00;
  if ((uVar18 * sStack_1a0.modulus.v[0] & 0x3fffffffffffffff) == 1) {
    if (psVar59 == (secp256k1_modinv64_modinfo *)0x0) {
LAB_001546ea:
      sStack_1d0.modulus_inv62 = (uint64_t)psVar59;
      sStack_170.modulus_inv62 = (uint64_t)m_00;
      sStack_1d0.modulus.v[2] = 0;
      sStack_1d0.modulus.v[3] = 0;
      sStack_1d0.modulus.v[0] = 0;
      sStack_1d0.modulus.v[1] = 0;
      sStack_1d0.modulus.v[4] = 0;
      uVar52 = 0;
      do {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar52 >> 1;
        puVar3 = (ulong *)((long)sStack_1d0.modulus.v +
                          (ulong)((uint)((uVar52 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) &
                                 0xfffffff8));
        *puVar3 = *puVar3 | (ulong)((*(ushort *)
                                      ((long)(psVar41->modulus).v + (uVar52 >> 4 & 0xfffffff) * 2)
                                     >> ((uint)uVar52 & 0xf) & 1) != 0) <<
                            ((char)(SUB164(auVar10 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                             (char)uVar52 & 0x3fU);
        uVar52 = uVar52 + 1;
      } while ((int)uVar52 != 0x100);
      iVar15 = 8;
      do {
        uVar54 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                 secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) +
                 secp256k1_test_state[0];
        uVar52 = uVar54 >> 0x1e;
        uVar54 = uVar54 >> 0x3e;
        lVar19 = sStack_1a0.modulus.v[uVar54];
        if (lVar19 < 1) {
LAB_001547ed:
          if (lVar19 < 0) {
            uVar52 = uVar52 + 0x100000000 >> 0x20;
            lVar25 = sStack_1a0.modulus.v[uVar52];
            if (-0x4000000000000000 < lVar25) {
              sStack_1a0.modulus.v[uVar54] = lVar19 + 0x4000000000000000;
              sStack_1a0.modulus.v[uVar52] = lVar25 + -1;
            }
          }
        }
        else {
          uVar29 = uVar52 + 0x100000000 >> 0x20;
          lVar25 = sStack_1a0.modulus.v[uVar29];
          if (0x3fffffffffffffff < lVar25) goto LAB_001547ed;
          sStack_1a0.modulus.v[uVar54] = lVar19 + -0x4000000000000000;
          sStack_1a0.modulus.v[uVar29] = lVar25 + 1;
        }
        uVar29 = secp256k1_test_state[1] << 0x11;
        uVar54 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
        uVar52 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
        secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar54;
        secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar52;
        secp256k1_test_state[2] = uVar54 ^ uVar29;
        secp256k1_test_state[3] = uVar52 << 0x2d | uVar52 >> 0x13;
        iVar15 = iVar15 + -1;
      } while (iVar15 != 0);
      sStack_1d0.modulus_inv62 =
           CONCAT44(sStack_1d0.modulus_inv62._4_4_,
                    (uint)((secp256k1_modinv64_modinfo *)sStack_1d0.modulus_inv62 !=
                          (secp256k1_modinv64_modinfo *)0x0));
      psVar59 = (secp256k1_modinv64_modinfo *)0x0;
      uVar52 = 0x84210843;
      while( true ) {
        iVar15 = (int)psVar59;
        pcVar30 = secp256k1_modinv64_var;
        if (iVar15 == 0) {
          pcVar30 = secp256k1_modinv64;
        }
        pcStack_1d8 = (code *)0x1548a1;
        (*pcVar30)(&sStack_1d0);
        (psVar67->modulus).v[2] = 0;
        (psVar67->modulus).v[3] = 0;
        (psVar67->modulus).v[0] = 0;
        (psVar67->modulus).v[1] = 0;
        uVar54 = 0;
        do {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar54 >> 1;
          puVar4 = (ushort *)((long)(psVar67->modulus).v + (uVar54 >> 4 & 0xfffffff) * 2);
          *puVar4 = *puVar4 | (ushort)((*(ulong *)((long)sStack_1d0.modulus.v +
                                                  (ulong)((uint)((uVar54 >> 1 & 0x7fffffff) *
                                                                 0x84210843 >> 0x21) & 0xfffffff8))
                                        >> ((ulong)((SUB164(auVar11 * ZEXT816(0x8421084210842109),8)
                                                    >> 4) * 2 + (int)uVar54) & 0x3f) & 1) != 0) <<
                              ((byte)uVar54 & 0xf);
          uVar54 = uVar54 + 1;
        } while ((int)uVar54 != 0x100);
        psVar48 = &sStack_170;
        pcStack_1d8 = (code *)0x154911;
        psVar31 = psVar67;
        mulmod256((uint16_t *)psVar48,(uint16_t *)psVar67,(uint16_t *)psVar41,
                  (uint16_t *)sStack_170.modulus_inv62);
        if ((short)sStack_170.modulus.v[0] != (short)sStack_1d0.modulus_inv62) break;
        lVar19 = 1;
        do {
          if (*(short *)((long)sStack_170.modulus.v + lVar19 * 2) != 0) {
            pcStack_1d8 = (code *)0x1549dc;
            test_modinv64_uint16_cold_4();
            goto LAB_001549dc;
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x10);
        pcStack_1d8 = (code *)0x154944;
        (*pcVar30)(&sStack_1d0);
        sStack_170.modulus.v[2] = 0;
        sStack_170.modulus.v[3] = 0;
        sStack_170.modulus.v[0] = 0;
        sStack_170.modulus.v[1] = 0;
        psVar31 = (secp256k1_modinv64_modinfo *)0x0;
        do {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = (ulong)psVar31 >> 1;
          psVar48 = (secp256k1_modinv64_modinfo *)
                    ((ulong)((*(ulong *)((long)sStack_1d0.modulus.v +
                                        (ulong)((uint)(((ulong)psVar31 >> 1 & 0x7fffffff) *
                                                       0x84210843 >> 0x21) & 0xfffffff8)) >>
                              ((ulong)((SUB164(auVar12 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                                      (int)psVar31) & 0x3f) & 1) != 0) << ((byte)psVar31 & 0xf));
          puVar4 = (ushort *)((long)sStack_170.modulus.v + ((ulong)psVar31 >> 4 & 0xfffffff) * 2);
          *puVar4 = *puVar4 | (ushort)psVar48;
          psVar31 = (secp256k1_modinv64_modinfo *)((long)(psVar31->modulus).v + 1);
        } while ((int)psVar31 != 0x100);
        lVar19 = 0;
        do {
          if (*(short *)((long)sStack_170.modulus.v + lVar19 * 2) !=
              *(short *)((long)(psVar41->modulus).v + lVar19 * 2)) goto LAB_001549dc;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x10);
        psVar59 = (secp256k1_modinv64_modinfo *)(ulong)(iVar15 + 1);
        if (iVar15 != 0) {
          return;
        }
      }
LAB_001549e1:
      pcStack_1d8 = (code *)0x1549e6;
      test_modinv64_uint16_cold_3();
      goto LAB_001549e6;
    }
    pcStack_1d8 = (code *)0x1545a2;
    mulmod256((uint16_t *)&sStack_170,(uint16_t *)psVar41,(uint16_t *)psVar41,(uint16_t *)m_00);
    sStack_1d0.modulus.v[2] = 0;
    sStack_1d0.modulus.v[3] = 0;
    sStack_1d0.modulus.v[0] = 0;
    sStack_1d0.modulus.v[1] = 0;
    sStack_1d0.modulus.v[4] = 0;
    uVar54 = 0;
    do {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar54 >> 1;
      puVar3 = (ulong *)((long)sStack_1d0.modulus.v +
                        (ulong)((uint)((uVar54 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8
                               ));
      *puVar3 = *puVar3 | (ulong)((*(ushort *)
                                    ((long)sStack_170.modulus.v + (uVar54 >> 4 & 0xfffffff) * 2) >>
                                   ((uint)uVar54 & 0xf) & 1) != 0) <<
                          ((char)(SUB164(auVar8 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                           (char)uVar54 & 0x3fU);
      uVar54 = uVar54 + 1;
    } while ((int)uVar54 != 0x100);
    psVar31 = &sStack_1a0;
    pcStack_1d8 = (code *)0x15461d;
    uVar14 = secp256k1_jacobi64_maybe_var(&sStack_1d0.modulus,psVar31);
    if (1 < uVar14) goto LAB_001549eb;
    uStack_140 = (short)(m_00->modulus).v[0] - 1;
    uStack_13e = *(undefined8 *)((long)(m_00->modulus).v + 2);
    iVar13 = (m_00->modulus).v[2];
    iStack_128 = (m_00->modulus).v[3];
    uStack_136 = (undefined6)*(undefined8 *)((long)(m_00->modulus).v + 10);
    uStack_130 = (undefined2)iVar13;
    uStack_12e = (undefined6)((ulong)iVar13 >> 0x10);
    pcStack_1d8 = (code *)0x154656;
    mulmod256((uint16_t *)&sStack_170,(uint16_t *)&sStack_170,&uStack_140,(uint16_t *)m_00);
    sStack_1d0.modulus.v[2] = 0;
    sStack_1d0.modulus.v[3] = 0;
    sStack_1d0.modulus.v[0] = 0;
    sStack_1d0.modulus.v[1] = 0;
    sStack_1d0.modulus.v[4] = 0;
    uVar54 = 0;
    do {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar54 >> 1;
      puVar3 = (ulong *)((long)sStack_1d0.modulus.v +
                        (ulong)((uint)((uVar54 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8
                               ));
      *puVar3 = *puVar3 | (ulong)((*(ushort *)
                                    ((long)sStack_170.modulus.v + (uVar54 >> 4 & 0xfffffff) * 2) >>
                                   ((uint)uVar54 & 0xf) & 1) != 0) <<
                          ((char)(SUB164(auVar9 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                           (char)uVar54 & 0x3fU);
      uVar54 = uVar54 + 1;
    } while ((int)uVar54 != 0x100);
    psVar31 = &sStack_1a0;
    pcStack_1d8 = (code *)0x1546d1;
    iVar15 = secp256k1_jacobi64_maybe_var(&sStack_1d0.modulus,psVar31);
    if ((iVar15 == 0) || (iVar15 == 1 - ((ushort)(m_00->modulus).v[0] & 2))) goto LAB_001546ea;
  }
  else {
LAB_001549e6:
    pcStack_1d8 = (code *)0x1549eb;
    test_modinv64_uint16_cold_1();
    psVar42 = psVar48;
LAB_001549eb:
    psVar47 = psVar42;
    pcStack_1d8 = (code *)0x1549f0;
    test_modinv64_uint16_cold_6();
  }
  pcStack_1d8 = modinv2p64;
  test_modinv64_uint16_cold_2();
  if (((ulong)psVar47 & 1) != 0) {
    iVar15 = 6;
    do {
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    return;
  }
  pcStack_1e0 = secp256k1_jacobi32_maybe_var;
  modinv2p64_cold_1();
  pcStack_1e0 = (code *)0x8421084210842109;
  psStack_1e8 = psVar67;
  psStack_1f0 = psVar41;
  uStack_1f8 = uVar52;
  psStack_200 = psVar59;
  psStack_208 = (secp256k1_modinv64_modinfo *)pcVar30;
  sStack_250.modulus.v[4]._0_4_ = (int32_t)(psVar31->modulus).v[4];
  sStack_250.modulus.v[2] = (psVar31->modulus).v[2];
  sStack_250.modulus.v[3] = (psVar31->modulus).v[3];
  sStack_250.modulus.v[0] = (psVar31->modulus).v[0];
  sStack_250.modulus.v[1] = (psVar31->modulus).v[1];
  iVar13 = (psVar47->modulus).v[0];
  sStack_280.modulus.v[1] = (psVar47->modulus).v[1];
  piVar1 = (psVar47->modulus).v + 2;
  sStack_280.modulus.v[2] = *piVar1;
  sStack_280.modulus.v[3] = (psVar47->modulus).v[3];
  sStack_280.modulus.v[0]._0_4_ = (uint)iVar13;
  sStack_280.modulus.v[0]._4_4_ = (uint)((ulong)iVar13 >> 0x20);
  sStack_280.modulus.v[4]._0_4_ = (int)(psVar47->modulus).v[4];
  auVar74 = packssdw(*(undefined1 (*) [16])(psVar47->modulus).v,*(undefined1 (*) [16])piVar1);
  psVar42 = psVar31;
  if (((((((((auVar74 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar74 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar74 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar74 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar74 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar74 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar74 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar74[0xf]) &&
     (-1 < (int)sStack_280.modulus.v[4])) {
    uVar14 = (uint)((ulong)sStack_280.modulus.v[1] >> 0x20) | (uint)sStack_280.modulus.v[1] |
             sStack_280.modulus.v[0]._4_4_ | (uint)sStack_280.modulus.v[0];
    psVar42 = (secp256k1_modinv64_modinfo *)(ulong)uVar14;
    psVar48 = psVar37;
    psVar66 = psVar41;
    if (((int)((ulong)sStack_280.modulus.v[3] >> 0x20) != 0 ||
        (((int)sStack_280.modulus.v[3] != 0 ||
         ((int)((ulong)sStack_280.modulus.v[2] >> 0x20) != 0 || (int)sStack_280.modulus.v[2] != 0))
        || uVar14 != 0)) || (int)sStack_280.modulus.v[4] != 0) {
      psVar66 = (secp256k1_modinv64_modinfo *)0x9;
      uVar52 = 0xffffffff;
      iStack_294 = 0;
      psVar59 = (secp256k1_modinv64_modinfo *)0x0;
      psStack_220 = psVar31;
      do {
        psVar31 = psStack_220;
        uVar28 = sStack_250.modulus.v[0]._4_4_ << 0x1e | (uint)sStack_250.modulus.v[0];
        pcVar30 = (code *)(ulong)uVar28;
        uVar40 = sStack_280.modulus.v[0]._4_4_ << 0x1e | (uint)sStack_280.modulus.v[0];
        psVar42 = (secp256k1_modinv64_modinfo *)(ulong)uVar40;
        uVar14 = 1;
        psVar55 = (secp256k1_modinv64_modinfo *)0x0;
        uVar16 = 0x1e;
        psVar47 = (secp256k1_modinv64_modinfo *)0x0;
        uVar57 = 1;
        psVar37 = (secp256k1_modinv64_modinfo *)pcVar30;
        psVar60 = psVar59;
        uVar39 = uVar40;
        while( true ) {
          uVar53 = (uint)psVar37;
          uVar35 = -1 << ((byte)uVar16 & 0x1f) | uVar39;
          uVar22 = 0;
          if (uVar35 != 0) {
            for (; (uVar35 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
          bVar21 = (byte)uVar22;
          uVar39 = uVar39 >> (bVar21 & 0x1f);
          uVar57 = uVar57 << (bVar21 & 0x1f);
          uVar35 = (int)psVar47 << (bVar21 & 0x1f);
          psVar47 = (secp256k1_modinv64_modinfo *)(ulong)uVar35;
          uVar63 = (int)uVar52 - uVar22;
          uVar52 = (ulong)uVar63;
          psVar48 = (secp256k1_modinv64_modinfo *)((ulong)psVar37 >> 1);
          uVar58 = ((uint)((ulong)psVar37 >> 2) ^ (uint)psVar48) & uVar22 ^ (uint)psVar60;
          psVar59 = (secp256k1_modinv64_modinfo *)(ulong)uVar58;
          uVar16 = uVar16 - uVar22;
          uVar22 = (uint)psVar55;
          psStack_218 = psVar66;
          if (uVar16 == 0) break;
          if (((ulong)psVar37 & 1) == 0) {
            psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154e40;
            secp256k1_jacobi32_maybe_var_cold_6();
LAB_00154e40:
            psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154e45;
            secp256k1_jacobi32_maybe_var_cold_5();
            psVar41 = psVar60;
LAB_00154e45:
            psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154e4a;
            secp256k1_jacobi32_maybe_var_cold_1();
LAB_00154e4a:
            psVar37 = psVar48;
            psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154e4f;
            secp256k1_jacobi32_maybe_var_cold_2();
LAB_00154e4f:
            psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154e54;
            secp256k1_jacobi32_maybe_var_cold_4();
            goto LAB_00154e54;
          }
          if ((uVar39 & 1) == 0) goto LAB_00154e40;
          uVar36 = uVar35 * uVar40 + uVar57 * uVar28;
          psVar48 = (secp256k1_modinv64_modinfo *)(ulong)uVar36;
          bVar21 = 0x1e - (char)uVar16;
          uVar65 = uVar53 << (bVar21 & 0x1f);
          psVar41 = (secp256k1_modinv64_modinfo *)(ulong)uVar65;
          if (uVar36 != uVar65) goto LAB_00154e45;
          uVar65 = uVar14 * uVar40 + uVar22 * uVar28;
          psVar41 = (secp256k1_modinv64_modinfo *)(ulong)uVar65;
          uVar36 = uVar39 << (bVar21 & 0x1f);
          psVar48 = (secp256k1_modinv64_modinfo *)(ulong)uVar36;
          if (uVar65 != uVar36) goto LAB_00154e4a;
          psVar41 = psVar55;
          if ((int)uVar63 < 0) {
            uVar52 = (ulong)-uVar63;
            psVar59 = (secp256k1_modinv64_modinfo *)(ulong)(uVar58 ^ (uVar39 & uVar53) >> 1);
            psVar37 = (secp256k1_modinv64_modinfo *)(ulong)uVar39;
            psVar47 = (secp256k1_modinv64_modinfo *)(ulong)uVar14;
            psVar41 = (secp256k1_modinv64_modinfo *)(ulong)uVar57;
            uVar57 = uVar22;
            uVar39 = uVar53;
            uVar14 = uVar35;
          }
          psVar67 = (secp256k1_modinv64_modinfo *)(ulong)uVar14;
          uVar22 = (int)uVar52 + 1;
          if ((int)uVar16 <= (int)uVar22) {
            uVar22 = uVar16;
          }
          if (0x1e < uVar22) goto LAB_00154e4f;
          uVar22 = (uint)(0xff << (-(char)uVar22 & 0x1fU)) >> (-(char)uVar22 & 0x1fU);
          uVar53 = secp256k1_modinv32_inv256[(uint)((ulong)psVar37 >> 1) & 0x7f] * uVar39 & uVar22;
          uVar39 = uVar53 * (int)psVar37 + uVar39;
          psVar55 = (secp256k1_modinv64_modinfo *)(ulong)(uVar53 * uVar57 + (int)psVar41);
          uVar14 = uVar53 * (int)psVar47 + uVar14;
          psVar60 = psVar59;
          uStack_210 = uVar52;
          if ((uVar39 & uVar22) != 0) {
LAB_00154e54:
            psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154e59;
            secp256k1_jacobi32_maybe_var_cold_3();
            goto LAB_00154e59;
          }
        }
        lVar19 = (long)(int)uVar14 * (long)(int)uVar57 - (long)(int)uVar22 * (long)(int)uVar35;
        psVar67 = &sStack_250;
        sStack_290.u = uVar57;
        sStack_290.v = uVar35;
        sStack_290.q = uVar22;
        sStack_290.r = uVar14;
        if ((lVar19 != -0x40000000) && (lVar19 != 0x40000000)) goto LAB_00154e8b;
        iVar23 = (int)psVar66;
        psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154cda;
        psVar42 = psVar66;
        psVar47 = psVar67;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar67,iVar23,
                            (secp256k1_modinv32_signed30 *)psStack_220,0);
        psVar37 = &sStack_280;
        if (iVar15 < 1) goto LAB_00154e5e;
        psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154cfa;
        psVar42 = psVar66;
        psVar47 = psVar67;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar67,iVar23,
                            (secp256k1_modinv32_signed30 *)psVar31,1);
        if (0 < iVar15) goto LAB_00154e63;
        psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154d12;
        psVar42 = psVar66;
        psVar47 = psVar37;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar37,iVar23,
                            (secp256k1_modinv32_signed30 *)psVar31,0);
        if (iVar15 < 1) goto LAB_00154e68;
        psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154d2d;
        psVar42 = psVar66;
        psVar47 = psVar37;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar37,iVar23,
                            (secp256k1_modinv32_signed30 *)psVar31,1);
        if (-1 < iVar15) goto LAB_00154e6d;
        psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154d48;
        secp256k1_modinv32_update_fg_30_var
                  (iVar23,(secp256k1_modinv32_signed30 *)psVar67,
                   (secp256k1_modinv32_signed30 *)psVar37,&sStack_290);
        if ((uint)sStack_250.modulus.v[0] == 1) {
          if (1 < iVar23) {
            uVar14 = 0;
            psVar41 = (secp256k1_modinv64_modinfo *)0x1;
            do {
              uVar14 = uVar14 | *(uint *)((long)sStack_250.modulus.v + (long)psVar41 * 4);
              psVar41 = (secp256k1_modinv64_modinfo *)((long)(psVar41->modulus).v + 1);
            } while (psVar66 != psVar41);
            if (uVar14 != 0) goto LAB_00154d77;
          }
          iStack_298 = 1 - (uVar58 * 2 & 2);
          bVar69 = false;
        }
        else {
LAB_00154d77:
          if ((-1 < iVar23 + -2 && *(int *)((long)sStack_250.modulus.v + (long)iVar23 * 4 + -4) == 0
              ) && *(int *)((long)sStack_280.modulus.v + (long)iVar23 * 4 + -4) == 0) {
            psVar66 = (secp256k1_modinv64_modinfo *)(ulong)(iVar23 - 1);
          }
          psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154da1;
          iVar23 = (int)psVar66;
          psVar42 = psVar66;
          psVar47 = psVar67;
          iVar15 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar67,iVar23,
                              (secp256k1_modinv32_signed30 *)psVar31,0);
          if (iVar15 < 1) goto LAB_00154e72;
          psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154dbc;
          psVar42 = psVar66;
          psVar47 = psVar67;
          iVar15 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar67,iVar23,
                              (secp256k1_modinv32_signed30 *)psVar31,1);
          if (0 < iVar15) goto LAB_00154e77;
          psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154dd4;
          psVar42 = psVar66;
          psVar47 = psVar37;
          iVar15 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar37,iVar23,
                              (secp256k1_modinv32_signed30 *)psVar31,0);
          if (iVar15 < 1) goto LAB_00154e7c;
          psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154def;
          psVar42 = psVar66;
          psVar47 = psVar37;
          iVar15 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar37,iVar23,
                              (secp256k1_modinv32_signed30 *)psVar31,1);
          bVar69 = true;
          if (-1 < iVar15) goto LAB_00154e81;
        }
        if ((!bVar69) || (iStack_294 = iStack_294 + 1, iStack_294 == 0x19)) {
          return;
        }
      } while( true );
    }
  }
  else {
LAB_00154e59:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154e5e;
    secp256k1_jacobi32_maybe_var_cold_17();
    psVar31 = (secp256k1_modinv64_modinfo *)pcVar30;
    psVar66 = psVar41;
LAB_00154e5e:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154e63;
    secp256k1_jacobi32_maybe_var_cold_14();
LAB_00154e63:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154e68;
    secp256k1_jacobi32_maybe_var_cold_13();
LAB_00154e68:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154e6d;
    secp256k1_jacobi32_maybe_var_cold_12();
LAB_00154e6d:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154e72;
    secp256k1_jacobi32_maybe_var_cold_11();
LAB_00154e72:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154e77;
    secp256k1_jacobi32_maybe_var_cold_10();
LAB_00154e77:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154e7c;
    secp256k1_jacobi32_maybe_var_cold_9();
LAB_00154e7c:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154e81;
    secp256k1_jacobi32_maybe_var_cold_8();
LAB_00154e81:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154e86;
    secp256k1_jacobi32_maybe_var_cold_7();
    psVar48 = psVar37;
  }
  psStack_2a8 = (secp256k1_modinv64_modinfo *)0x154e8b;
  secp256k1_jacobi32_maybe_var_cold_16();
LAB_00154e8b:
  psStack_2a8 = (secp256k1_modinv64_modinfo *)secp256k1_modinv32_var;
  secp256k1_jacobi32_maybe_var_cold_15();
  psStack_2a8 = psVar48;
  psStack_2b0 = psVar67;
  psStack_2b8 = psVar66;
  uStack_2c0 = uVar52;
  psStack_2c8 = psVar59;
  psStack_2d0 = psVar31;
  psVar67 = (secp256k1_modinv64_modinfo *)0x0;
  sStack_328.modulus.v[4]._0_4_ = 0;
  sStack_328.modulus.v[2] = 0;
  sStack_328.modulus.v[3] = 0;
  sStack_328.modulus.v[0] = 0;
  sStack_328.modulus.v[1] = 0;
  sStack_2f8.v[2] = 0;
  sStack_2f8.v[3] = 0;
  sStack_2f8.v[8] = 0;
  sStack_2f8.v[4] = 0;
  sStack_2f8.v[5] = 0;
  sStack_2f8.v[6] = 0;
  sStack_2f8.v[7] = 0;
  sStack_2f8.v[0] = 1;
  sStack_2f8.v[1] = 0;
  sStack_368.modulus.v[4]._0_4_ = (int32_t)(psVar42->modulus).v[4];
  sStack_368.modulus.v[2] = (psVar42->modulus).v[2];
  sStack_368.modulus.v[3] = (psVar42->modulus).v[3];
  sStack_368.modulus.v[0] = (psVar42->modulus).v[0];
  sStack_368.modulus.v[1] = (psVar42->modulus).v[1];
  sStack_398.modulus.v[4]._0_4_ = (int32_t)(psVar47->modulus).v[4];
  sStack_398.modulus.v[0] = (psVar47->modulus).v[0];
  sStack_398.modulus.v[1] = (psVar47->modulus).v[1];
  sStack_368.modulus_inv62 = (uint64_t)psVar47;
  sStack_398.modulus.v[2] = (psVar47->modulus).v[2];
  sStack_398.modulus.v[3] = (psVar47->modulus).v[3];
  modinfo = (secp256k1_modinv32_modinfo *)0xffffffff;
  psVar37 = (secp256k1_modinv64_modinfo *)0x9;
  puVar38 = secp256k1_modinv32_inv256;
  psStack_338 = psVar42;
  do {
    psVar31 = psStack_338;
    uStack_3ac = (uint)psVar67;
    psVar61 = (secp256k1_modinv32_modinfo *)(sStack_368.modulus.v[0] & 0xffffffff);
    psVar47 = (secp256k1_modinv64_modinfo *)(sStack_398.modulus.v[0] & 0xffffffff);
    uVar14 = 1;
    psVar59 = (secp256k1_modinv64_modinfo *)0x0;
    iVar15 = 0x1e;
    uVar16 = 0;
    psVar41 = (secp256k1_modinv64_modinfo *)0x1;
    uVar57 = (uint)sStack_368.modulus.v[0];
    uVar39 = (uint)sStack_398.modulus.v[0];
    while( true ) {
      uVar28 = -1 << ((byte)iVar15 & 0x1f) | uVar39;
      psVar48 = (secp256k1_modinv64_modinfo *)(ulong)uVar28;
      iVar23 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar23 & 1) == 0; iVar23 = iVar23 + 1) {
        }
      }
      bVar21 = (byte)iVar23;
      uVar39 = uVar39 >> (bVar21 & 0x1f);
      uVar40 = (int)psVar41 << (bVar21 & 0x1f);
      psVar41 = (secp256k1_modinv64_modinfo *)(ulong)uVar40;
      uVar16 = uVar16 << (bVar21 & 0x1f);
      uVar28 = (int)modinfo - iVar23;
      modinfo = (secp256k1_modinv32_modinfo *)(ulong)uVar28;
      iVar15 = iVar15 - iVar23;
      iVar23 = (int)psVar59;
      psStack_330 = psVar37;
      if (iVar15 == 0) break;
      if ((uVar57 & 1) == 0) {
        pcStack_3c0 = (code *)0x15534e;
        secp256k1_modinv32_var_cold_7();
LAB_0015534e:
        pcStack_3c0 = (code *)0x155353;
        secp256k1_modinv32_var_cold_6();
LAB_00155353:
        pcStack_3c0 = (code *)0x155358;
        secp256k1_modinv32_var_cold_1();
LAB_00155358:
        pcStack_3c0 = (code *)0x15535d;
        secp256k1_modinv32_var_cold_2();
LAB_0015535d:
        pcStack_3c0 = (code *)0x155362;
        secp256k1_modinv32_var_cold_5();
LAB_00155362:
        pcStack_3c0 = (code *)0x155367;
        secp256k1_modinv32_var_cold_4();
        goto LAB_00155367;
      }
      if ((uVar39 & 1) == 0) goto LAB_0015534e;
      uVar22 = uVar16 * (uint)sStack_398.modulus.v[0] + uVar40 * (uint)sStack_368.modulus.v[0];
      psVar48 = (secp256k1_modinv64_modinfo *)(ulong)uVar22;
      bVar21 = 0x1e - (char)iVar15;
      uVar53 = uVar57 << (bVar21 & 0x1f);
      psVar67 = (secp256k1_modinv64_modinfo *)(ulong)uVar53;
      if (uVar22 != uVar53) goto LAB_00155353;
      uVar53 = uVar14 * (uint)sStack_398.modulus.v[0] + iVar23 * (uint)sStack_368.modulus.v[0];
      psVar67 = (secp256k1_modinv64_modinfo *)(ulong)uVar53;
      uVar22 = uVar39 << (bVar21 & 0x1f);
      psVar48 = (secp256k1_modinv64_modinfo *)(ulong)uVar22;
      if (uVar53 != uVar22) goto LAB_00155358;
      if (uVar28 - 0x2f0 < 0xfffffa21) goto LAB_0015535d;
      psVar67 = psVar59;
      if ((int)uVar28 < 0) {
        modinfo = (secp256k1_modinv32_modinfo *)(ulong)-uVar28;
        uVar28 = -uVar57;
        uVar22 = -uVar16;
        psVar41 = psVar59;
        psVar67 = (secp256k1_modinv64_modinfo *)(ulong)-uVar40;
        uVar57 = uVar39;
        uVar39 = uVar28;
        uVar16 = uVar14;
        uVar14 = uVar22;
      }
      psVar48 = (secp256k1_modinv64_modinfo *)(ulong)uVar14;
      iVar23 = (int)modinfo + 1;
      if (iVar15 <= iVar23) {
        iVar23 = iVar15;
      }
      if (iVar23 - 0x1fU < 0xffffffe2) goto LAB_00155362;
      uVar40 = (uint)(0xff << (-(char)iVar23 & 0x1fU)) >> (-(char)iVar23 & 0x1fU);
      psVar42 = (secp256k1_modinv64_modinfo *)(ulong)uVar40;
      uVar28 = secp256k1_modinv32_inv256[uVar57 >> 1 & 0x7f] * uVar39 & uVar40;
      uVar39 = uVar39 + uVar28 * uVar57;
      psVar59 = (secp256k1_modinv64_modinfo *)(ulong)(uVar28 * (int)psVar41 + (int)psVar67);
      uVar14 = uVar28 * uVar16 + uVar14;
      if ((uVar39 & uVar40) != 0) {
LAB_00155367:
        pcStack_3c0 = (code *)0x15536c;
        secp256k1_modinv32_var_cold_3();
        goto LAB_0015536c;
      }
    }
    sStack_3a8.u = uVar40;
    sStack_3a8.v = uVar16;
    sStack_3a8.q = iVar23;
    sStack_3a8.r = uVar14;
    if ((long)(int)uVar14 * (long)(int)uVar40 - (long)iVar23 * (long)(int)uVar16 != 0x40000000) {
LAB_0015536c:
      pcStack_3c0 = (code *)0x155371;
      secp256k1_modinv32_var_cold_8();
      psVar37 = psVar48;
      psVar31 = psVar42;
LAB_00155371:
      pcStack_3c0 = (code *)0x155376;
      secp256k1_modinv32_var_cold_19();
LAB_00155376:
      pcStack_3c0 = (code *)0x15537b;
      secp256k1_modinv32_var_cold_18();
LAB_0015537b:
      pcStack_3c0 = (code *)0x155380;
      secp256k1_modinv32_var_cold_17();
LAB_00155380:
      pcStack_3c0 = (code *)0x155385;
      secp256k1_modinv32_var_cold_16();
LAB_00155385:
      pcStack_3c0 = (code *)0x15538a;
      secp256k1_modinv32_var_cold_13();
LAB_0015538a:
      pcStack_3c0 = (code *)0x15538f;
      secp256k1_modinv32_var_cold_12();
LAB_0015538f:
      pcStack_3c0 = (code *)0x155394;
      secp256k1_modinv32_var_cold_11();
LAB_00155394:
      pcStack_3c0 = (code *)0x155399;
      secp256k1_modinv32_var_cold_10();
LAB_00155399:
      pcStack_3c0 = (code *)0x15539e;
      secp256k1_modinv32_var_cold_9();
      goto LAB_0015539e;
    }
    pcStack_3c0 = (code *)0x1550cf;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)&sStack_328,&sStack_2f8,&sStack_3a8,
               (secp256k1_modinv32_modinfo *)psStack_338);
    psVar37 = psStack_330;
    psVar41 = &sStack_368;
    iVar23 = (int)psStack_330;
    psVar61 = (secp256k1_modinv32_modinfo *)((ulong)psStack_330 & 0xffffffff);
    pcStack_3c0 = (code *)0x1550ee;
    psVar47 = psVar41;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar41,iVar23,
                        (secp256k1_modinv32_signed30 *)psVar31,-1);
    if (iVar15 < 1) goto LAB_00155371;
    psVar61 = (secp256k1_modinv32_modinfo *)((ulong)psVar37 & 0xffffffff);
    pcStack_3c0 = (code *)0x155108;
    psVar47 = psVar41;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar41,iVar23,
                        (secp256k1_modinv32_signed30 *)psVar31,1);
    if (0 < iVar15) goto LAB_00155376;
    psVar67 = &sStack_398;
    psVar61 = (secp256k1_modinv32_modinfo *)((ulong)psVar37 & 0xffffffff);
    pcStack_3c0 = (code *)0x155127;
    psVar47 = psVar67;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar67,iVar23,
                        (secp256k1_modinv32_signed30 *)psVar31,-1);
    if (iVar15 < 1) goto LAB_0015537b;
    psVar61 = (secp256k1_modinv32_modinfo *)((ulong)psVar37 & 0xffffffff);
    pcStack_3c0 = (code *)0x155141;
    psVar47 = psVar67;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar67,iVar23,
                        (secp256k1_modinv32_signed30 *)psVar31,1);
    if (-1 < iVar15) goto LAB_00155380;
    pcStack_3c0 = (code *)0x15515b;
    secp256k1_modinv32_update_fg_30_var
              (iVar23,(secp256k1_modinv32_signed30 *)psVar41,(secp256k1_modinv32_signed30 *)psVar67,
               &sStack_3a8);
    uVar14 = uStack_3ac;
    psVar67 = (secp256k1_modinv64_modinfo *)(ulong)uStack_3ac;
    if ((uint)sStack_398.modulus.v[0] != 0) {
LAB_0015516b:
      uVar57 = *(uint *)((long)sStack_368.modulus.v + (long)iVar23 * 4 + -4);
      uVar39 = *(uint *)((long)sStack_398.modulus.v + (long)iVar23 * 4 + -4);
      iVar15 = iVar23 + -2;
      uVar16 = (int)uVar57 >> 0x1f ^ uVar57 | iVar15 >> 0x1f;
      psVar47 = (secp256k1_modinv64_modinfo *)(ulong)uVar16;
      uVar16 = (int)uVar39 >> 0x1f ^ uVar39 | uVar16;
      psVar61 = (secp256k1_modinv32_modinfo *)(ulong)uVar16;
      if (uVar16 == 0) {
        psVar37 = (secp256k1_modinv64_modinfo *)(ulong)(iVar23 - 1);
        puVar2 = (uint *)((long)sStack_368.modulus.v + (long)iVar15 * 4);
        *puVar2 = *puVar2 | uVar57 << 0x1e;
        puVar2 = (uint *)((long)sStack_398.modulus.v + (long)iVar15 * 4);
        *puVar2 = *puVar2 | uVar39 << 0x1e;
      }
      if (0x17 < (int)uStack_3ac) goto LAB_00155385;
      iVar23 = (int)psVar37;
      psVar61 = (secp256k1_modinv32_modinfo *)((ulong)psVar37 & 0xffffffff);
      pcStack_3c0 = (code *)0x1551c1;
      psVar47 = psVar41;
      iVar15 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar41,iVar23,
                          (secp256k1_modinv32_signed30 *)psVar31,-1);
      if (iVar15 < 1) goto LAB_0015538a;
      psVar61 = (secp256k1_modinv32_modinfo *)((ulong)psVar37 & 0xffffffff);
      pcStack_3c0 = (code *)0x1551db;
      psVar47 = psVar41;
      iVar15 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar41,iVar23,
                          (secp256k1_modinv32_signed30 *)psVar31,1);
      if (0 < iVar15) goto LAB_0015538f;
      psVar41 = &sStack_398;
      psVar61 = (secp256k1_modinv32_modinfo *)((ulong)psVar37 & 0xffffffff);
      pcStack_3c0 = (code *)0x1551fa;
      psVar47 = psVar41;
      iVar15 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar41,iVar23,
                          (secp256k1_modinv32_signed30 *)psVar31,-1);
      if (iVar15 < 1) goto LAB_00155394;
      psVar61 = (secp256k1_modinv32_modinfo *)((ulong)psVar37 & 0xffffffff);
      pcStack_3c0 = (code *)0x155214;
      psVar47 = psVar41;
      iVar15 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar41,iVar23,
                          (secp256k1_modinv32_signed30 *)psVar31,1);
      if (iVar15 < 0) {
        psVar67 = (secp256k1_modinv64_modinfo *)(ulong)(uVar14 + 1);
        uVar57 = 1;
        goto LAB_00155247;
      }
      goto LAB_00155399;
    }
    uVar57 = 0;
    if (1 < iVar23) {
      uVar52 = 1;
      do {
        uVar57 = uVar57 | *(uint *)((long)sStack_398.modulus.v + uVar52 * 4);
        uVar52 = uVar52 + 1;
      } while (((ulong)psVar37 & 0xffffffff) != uVar52);
      if (uVar57 != 0) goto LAB_0015516b;
      uVar57 = 0;
    }
LAB_00155247:
    psVar42 = psVar31;
  } while ((char)uVar57 != '\0');
  psVar47 = &sStack_398;
  iVar23 = (int)psVar37;
  psVar61 = (secp256k1_modinv32_modinfo *)((ulong)psVar37 & 0xffffffff);
  pcStack_3c0 = (code *)0x155264;
  iVar15 = secp256k1_modinv32_mul_cmp_30
                     ((secp256k1_modinv32_signed30 *)psVar47,iVar23,&SECP256K1_SIGNED30_ONE,0);
  if (iVar15 == 0) {
    pcStack_3c0 = (code *)0x155284;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_368,iVar23,&SECP256K1_SIGNED30_ONE,-1
                       );
    psVar67 = (secp256k1_modinv64_modinfo *)sStack_368.modulus_inv62;
    if (iVar15 == 0) {
LAB_00155306:
      pcStack_3c0 = (code *)0x155320;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)&sStack_328,
                 *(int32_t *)((long)sStack_368.modulus.v + (long)iVar23 * 4 + -4),
                 (secp256k1_modinv32_modinfo *)psVar31);
      *(int32_t *)((psVar67->modulus).v + 4) = (int32_t)sStack_328.modulus.v[4];
      (psVar67->modulus).v[2] = sStack_328.modulus.v[2];
      (psVar67->modulus).v[3] = sStack_328.modulus.v[3];
      (psVar67->modulus).v[0] = sStack_328.modulus.v[0];
      (psVar67->modulus).v[1] = sStack_328.modulus.v[1];
      return;
    }
    pcStack_3c0 = (code *)0x1552a5;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_368,iVar23,&SECP256K1_SIGNED30_ONE,1)
    ;
    if (iVar15 == 0) goto LAB_00155306;
    psVar61 = (secp256k1_modinv32_modinfo *)0x9;
    pcStack_3c0 = (code *)0x1552bf;
    psVar47 = psVar67;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar67,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar15 == 0) {
      psVar47 = &sStack_328;
      psVar61 = (secp256k1_modinv32_modinfo *)0x9;
      pcStack_3c0 = (code *)0x1552e2;
      iVar15 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar47,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar15 == 0) {
        psVar47 = &sStack_368;
        psVar61 = (secp256k1_modinv32_modinfo *)((ulong)psVar37 & 0xffffffff);
        pcStack_3c0 = (code *)0x1552fe;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar47,iVar23,
                            (secp256k1_modinv32_signed30 *)psVar31,1);
        if (iVar15 == 0) goto LAB_00155306;
      }
    }
  }
  else {
LAB_0015539e:
    pcStack_3c0 = (code *)0x1553a3;
    secp256k1_modinv32_var_cold_14();
  }
  pcStack_3c0 = secp256k1_modinv32;
  secp256k1_modinv32_var_cold_15();
  pcStack_3c0 = (code *)secp256k1_modinv32_inv256;
  psStack_3c8 = psVar31;
  psStack_3d0 = psVar67;
  psStack_3d8 = psVar41;
  psStack_3e0 = modinfo;
  psStack_3e8 = psVar37;
  uVar14 = 0;
  sStack_440.modulus.v[4]._0_4_ = 0;
  sStack_440.modulus.v[2] = 0;
  sStack_440.modulus.v[3] = 0;
  sStack_440.modulus.v[0] = 0;
  sStack_440.modulus.v[1] = 0;
  sStack_410.v[2] = 0;
  sStack_410.v[3] = 0;
  sStack_410.v[8] = 0;
  sStack_410.v[4] = 0;
  sStack_410.v[5] = 0;
  sStack_410.v[6] = 0;
  sStack_410.v[7] = 0;
  sStack_410.v[0] = 1;
  sStack_410.v[1] = 0;
  sStack_4c0.modulus.v[4]._0_4_ = (psVar61->modulus).v[8];
  sStack_4c0.modulus.v[2] = *(int64_t *)((psVar61->modulus).v + 4);
  sStack_4c0.modulus.v[3] = *(int64_t *)((psVar61->modulus).v + 6);
  sStack_4c0.modulus.v[0] = *(int64_t *)(psVar61->modulus).v;
  sStack_4c0.modulus.v[1] = *(int64_t *)((psVar61->modulus).v + 2);
  sStack_480.modulus.v[4]._0_4_ = (int32_t)(psVar47->modulus).v[4];
  sStack_480.modulus.v[0] = (psVar47->modulus).v[0];
  sStack_480.modulus.v[1] = (psVar47->modulus).v[1];
  psStack_450 = psVar47;
  sStack_480.modulus.v[2] = (psVar47->modulus).v[2];
  sStack_480.modulus.v[3] = (psVar47->modulus).v[3];
  uVar52 = 0xffffffff;
  psStack_4d8 = psVar61;
  do {
    lStack_448 = (long)(int)(uint)sStack_4c0.modulus.v[0];
    uVar29 = (ulong)(int)(uint)sStack_480.modulus.v[0];
    uVar54 = 0;
    psVar41 = (secp256k1_modinv64_modinfo *)0x1;
    uVar57 = 0;
    uVar28 = 0;
    uVar40 = 1;
    uVar39 = (uint)sStack_480.modulus.v[0];
    uVar16 = (uint)sStack_4c0.modulus.v[0];
    do {
      uVar22 = (uint)sStack_4c0.modulus.v[0];
      uStack_4cc = uVar14;
      if ((uVar16 & 1) == 0) {
        psStack_4e8 = (secp256k1_modinv64_modinfo *)0x15585f;
        secp256k1_modinv32_cold_17();
LAB_0015585f:
        psStack_4e8 = (secp256k1_modinv64_modinfo *)0x155864;
        secp256k1_modinv32_cold_1();
LAB_00155864:
        psStack_4e8 = (secp256k1_modinv64_modinfo *)0x155869;
        secp256k1_modinv32_cold_2();
        psVar61 = modinfo;
LAB_00155869:
        psStack_4e8 = (secp256k1_modinv64_modinfo *)0x15586e;
        secp256k1_modinv32_cold_16();
        goto LAB_0015586e;
      }
      uVar58 = (uint)psVar41;
      uVar35 = uVar57 * (uint)sStack_480.modulus.v[0] + uVar58 * (uint)sStack_4c0.modulus.v[0];
      puVar38 = (uint8_t *)(ulong)uVar35;
      uVar53 = uVar16 << ((byte)uVar54 & 0x1f);
      psVar37 = (secp256k1_modinv64_modinfo *)(ulong)uVar53;
      if (uVar35 != uVar53) goto LAB_0015585f;
      uVar35 = uVar40 * (uint)sStack_480.modulus.v[0] + uVar28 * (uint)sStack_4c0.modulus.v[0];
      puVar38 = (uint8_t *)(ulong)uVar35;
      uVar53 = uVar39 << ((byte)uVar54 & 0x1f);
      psVar37 = (secp256k1_modinv64_modinfo *)(ulong)uVar53;
      if (uVar35 != uVar53) goto LAB_00155864;
      uStack_4c4 = (int)(uint)uVar52 >> 0x1f;
      puVar38 = (uint8_t *)(ulong)uStack_4c4;
      uStack_4c8 = uVar39 & 1;
      uVar53 = -uStack_4c8;
      psVar67 = (secp256k1_modinv64_modinfo *)(ulong)uVar53;
      uVar35 = uStack_4c4 & uVar53;
      psVar37 = (secp256k1_modinv64_modinfo *)(ulong)uVar35;
      uVar63 = (uint)uVar52 ^ uVar35;
      uVar52 = (ulong)uVar63;
      psVar61 = (secp256k1_modinv32_modinfo *)(ulong)(uVar63 - 0x25b);
      if (uVar63 - 0x25b < 0xfffffb4d) goto LAB_00155869;
      uVar52 = (ulong)(uVar63 - 1);
      uVar40 = uVar40 + ((uStack_4c4 ^ uVar57) - uStack_4c4 & uVar53);
      uVar57 = (uVar57 + (uVar40 & uVar35)) * 2;
      uVar28 = uVar28 + ((uStack_4c4 ^ uVar58) - uStack_4c4 & uVar53);
      uVar58 = (uVar58 + (uVar28 & uVar35)) * 2;
      psVar41 = (secp256k1_modinv64_modinfo *)(ulong)uVar58;
      uVar53 = ((uStack_4c4 ^ uVar16) - uStack_4c4 & uVar53) + uVar39;
      uVar39 = uVar53 >> 1;
      uVar53 = uVar53 & uVar35;
      modinfo = (secp256k1_modinv32_modinfo *)(ulong)uVar53;
      uVar16 = uVar16 + uVar53;
      uVar53 = (int)uVar54 + 1;
      uVar54 = (ulong)uVar53;
    } while (uVar53 != 0x1e);
    psVar37 = (secp256k1_modinv64_modinfo *)(long)(int)uVar58;
    psVar67 = (secp256k1_modinv64_modinfo *)(long)(int)uVar40;
    puVar38 = (uint8_t *)(long)(int)uVar57;
    psVar61 = (secp256k1_modinv32_modinfo *)(long)(int)uVar28;
    uVar54 = (long)psVar37 * (long)psVar67 - (long)puVar38 * (long)psVar61;
    sStack_490.u = uVar58;
    sStack_490.v = uVar57;
    sStack_490.q = uVar28;
    sStack_490.r = uVar40;
    if (uVar54 != 0x40000000) {
LAB_0015586e:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x155873;
      secp256k1_modinv32_cold_3();
LAB_00155873:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x155878;
      secp256k1_modinv32_cold_15();
LAB_00155878:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x15587d;
      secp256k1_modinv32_cold_14();
LAB_0015587d:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x155882;
      secp256k1_modinv32_cold_13();
LAB_00155882:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x155887;
      secp256k1_modinv32_cold_12();
LAB_00155887:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x15588c;
      secp256k1_modinv32_cold_4();
LAB_0015588c:
      modinfo = psVar61;
      uVar14 = (uint)uVar54;
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x155891;
      secp256k1_modinv32_cold_5();
LAB_00155891:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x155896;
      secp256k1_modinv32_cold_11();
LAB_00155896:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x15589b;
      secp256k1_modinv32_cold_10();
LAB_0015589b:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x1558a0;
      secp256k1_modinv32_cold_9();
LAB_001558a0:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x1558a5;
      secp256k1_modinv32_cold_8();
      goto LAB_001558a5;
    }
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x155591;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)&sStack_440,&sStack_410,&sStack_490,psStack_4d8);
    psVar41 = &sStack_4c0;
    uVar22 = 9;
    uVar54 = 0xffffffff;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x1555aa;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar41,9,&psStack_4d8->modulus,-1);
    if (iVar15 < 1) goto LAB_00155873;
    psVar41 = &sStack_4c0;
    uVar22 = 9;
    uVar54 = 1;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x1555cb;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar41,9,&psStack_4d8->modulus,1);
    if (0 < iVar15) goto LAB_00155878;
    psVar41 = &sStack_480;
    uVar22 = 9;
    uVar54 = 0xffffffff;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x1555ec;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar41,9,&psStack_4d8->modulus,-1);
    if (iVar15 < 1) goto LAB_0015587d;
    psVar41 = &sStack_480;
    uVar22 = 9;
    uVar54 = 1;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x15560d;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar41,9,&psStack_4d8->modulus,1);
    modinfo = psStack_4d8;
    if (-1 < iVar15) goto LAB_00155882;
    uVar54 = (long)psVar37 * lStack_448;
    uVar20 = (long)puVar38 * uVar29 + uVar54;
    if ((uVar20 & 0x3ffffffe) != 0) goto LAB_00155887;
    uVar29 = uVar29 * (long)psVar67 + lStack_448 * (long)psVar61;
    if ((uVar29 & 0x3fffffff) != 0) goto LAB_0015588c;
    uVar29 = (long)uVar29 >> 0x1e;
    lVar19 = (long)uVar20 >> 0x1e;
    lVar25 = 1;
    do {
      lVar26 = (long)*(int *)((long)sStack_4c0.modulus.v + lVar25 * 4);
      lVar43 = (long)*(int *)((long)sStack_480.modulus.v + lVar25 * 4);
      lVar19 = lVar43 * (long)puVar38 + lVar26 * (long)psVar37 + lVar19;
      lVar26 = lVar43 * (long)psVar67 + lVar26 * (long)psVar61 + uVar29;
      (&uStack_4c4)[lVar25] = (uint)lVar19 & 0x3fffffff;
      *(uint *)((long)sStack_480.modulus.v + lVar25 * 4 + -4) = (uint)lVar26 & 0x3fffffff;
      lVar25 = lVar25 + 1;
      uVar29 = lVar26 >> 0x1e;
      lVar19 = lVar19 >> 0x1e;
    } while (lVar25 != 9);
    sStack_4c0.modulus.v[4]._0_4_ = (int32_t)lVar19;
    sStack_480.modulus.v[4]._0_4_ = (int32_t)uVar29;
    psVar37 = &sStack_4c0;
    uVar22 = 9;
    uVar14 = 0xffffffff;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x1556e1;
    psVar41 = psVar37;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar37,9,&psStack_4d8->modulus,-1);
    if (iVar15 < 1) goto LAB_00155891;
    uVar22 = 9;
    uVar14 = 1;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x1556fe;
    psVar41 = psVar37;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar37,9,&modinfo->modulus,1);
    if (0 < iVar15) goto LAB_00155896;
    psVar37 = &sStack_480;
    uVar22 = 9;
    uVar14 = 0xffffffff;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x155720;
    psVar41 = psVar37;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar37,9,&modinfo->modulus,-1);
    if (iVar15 < 1) goto LAB_0015589b;
    uVar22 = 9;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x15573d;
    psVar41 = psVar37;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar37,9,&modinfo->modulus,1);
    uVar14 = uStack_4cc;
    if (-1 < iVar15) goto LAB_001558a0;
    uVar14 = uStack_4cc + 1;
  } while (uVar14 != 0x14);
  psVar41 = &sStack_480;
  uVar22 = 9;
  uVar14 = 0;
  psStack_4e8 = (secp256k1_modinv64_modinfo *)0x15576c;
  iVar15 = secp256k1_modinv32_mul_cmp_30
                     ((secp256k1_modinv32_signed30 *)psVar41,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar15 == 0) {
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x15578f;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_4c0,9,&SECP256K1_SIGNED30_ONE,-1);
    psVar67 = psStack_450;
    if (iVar15 == 0) {
LAB_0015581a:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x155831;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)&sStack_440,(int32_t)sStack_4c0.modulus.v[4],modinfo
                );
      *(int32_t *)((psVar67->modulus).v + 4) = (int32_t)sStack_440.modulus.v[4];
      (psVar67->modulus).v[2] = sStack_440.modulus.v[2];
      (psVar67->modulus).v[3] = sStack_440.modulus.v[3];
      (psVar67->modulus).v[0] = sStack_440.modulus.v[0];
      (psVar67->modulus).v[1] = sStack_440.modulus.v[1];
      return;
    }
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x1557b6;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_4c0,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar15 == 0) goto LAB_0015581a;
    uVar22 = 9;
    uVar14 = 0;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x1557d0;
    psVar41 = psVar67;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar67,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar15 == 0) {
      psVar41 = &sStack_440;
      uVar22 = 9;
      uVar14 = 0;
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x1557f3;
      iVar15 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar41,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar15 == 0) {
        psVar41 = &sStack_4c0;
        uVar22 = 9;
        uVar14 = 1;
        psStack_4e8 = (secp256k1_modinv64_modinfo *)0x155812;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar41,9,&modinfo->modulus,1);
        if (iVar15 == 0) goto LAB_0015581a;
      }
    }
  }
  else {
LAB_001558a5:
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x1558aa;
    secp256k1_modinv32_cold_6();
  }
  psStack_4e8 = (secp256k1_modinv64_modinfo *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_01 = &sStack_538;
  piVar32 = (int *)(ulong)uVar14;
  pcStack_540 = (code *)0x1558cf;
  psStack_4f0 = psVar37;
  psStack_4e8 = psVar67;
  secp256k1_modinv32_mul_30(&sStack_514,(secp256k1_modinv32_signed30 *)psVar41,uVar22,1);
  pcStack_540 = (code *)0x1558e1;
  piVar56 = piVar32;
  psVar44 = a_00;
  secp256k1_modinv32_mul_30(&sStack_538,a_00,9,uVar14);
  lVar19 = 0;
  while ((uint)sStack_514.v[lVar19] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_538.v[lVar19]) goto LAB_00155933;
    lVar19 = lVar19 + 1;
    if (lVar19 == 8) {
      uVar14 = 8;
      while( true ) {
        if (sStack_514.v[uVar14] < sStack_538.v[uVar14]) {
          return;
        }
        if (sStack_538.v[uVar14] < sStack_514.v[uVar14]) break;
        bVar69 = uVar14 == 0;
        uVar14 = uVar14 - 1;
        if (bVar69) {
          return;
        }
      }
      return;
    }
  }
  pcStack_540 = (code *)0x155933;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_00155933:
  pcStack_540 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar15 = (int)a_01;
  piStack_568 = piVar32;
  psStack_560 = modinfo;
  uStack_558 = uVar29;
  uStack_548 = uVar52;
  pcStack_540 = (code *)puVar38;
  if (iVar15 < 1) {
    psStack_578 = (secp256k1_modinv32_signed30 *)0x155a26;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_00155a26:
    iVar24 = (int)piVar56;
    psStack_578 = (secp256k1_modinv32_signed30 *)0x155a2b;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar23 = piVar56[1];
    iVar5 = *piVar56;
    piVar32 = (int *)(long)psVar44->v[0];
    uVar54 = (long)*extraout_RDX * (long)iVar23 + (long)piVar32 * (long)iVar5;
    if ((uVar54 & 0x3fffffff) != 0) goto LAB_00155a26;
    iVar6 = piVar56[3];
    iVar24 = piVar56[2];
    piVar32 = (int *)((long)piVar32 * (long)iVar24);
    piVar56 = (int *)((long)*extraout_RDX * (long)iVar6 + (long)piVar32);
    if (((ulong)piVar56 & 0x3fffffff) == 0) {
      lVar25 = (long)piVar56 >> 0x1e;
      lVar19 = (long)uVar54 >> 0x1e;
      if (iVar15 != 1) {
        uVar52 = 1;
        do {
          lVar19 = (long)extraout_RDX[uVar52] * (long)iVar23 +
                   (long)psVar44->v[uVar52] * (long)iVar5 + lVar19;
          lVar25 = (long)extraout_RDX[uVar52] * (long)iVar6 +
                   (long)psVar44->v[uVar52] * (long)iVar24 + lVar25;
          psVar44->v[uVar52 - 1] = (uint)lVar19 & 0x3fffffff;
          extraout_RDX[uVar52 - 1] = (uint)lVar25 & 0x3fffffff;
          uVar52 = uVar52 + 1;
          lVar25 = lVar25 >> 0x1e;
          lVar19 = lVar19 >> 0x1e;
        } while (((ulong)a_01 & 0xffffffff) != uVar52);
      }
      psVar44->v[(long)iVar15 + -1] = (int32_t)lVar19;
      extraout_RDX[(long)iVar15 + -1] = (int)lVar25;
      return;
    }
  }
  psStack_578 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar19 = 0;
  psStack_578 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar19 < extraout_EDX) {
      psStack_578 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_578->v + (long)psVar44->v[lVar19] * (long)iVar24);
    }
    a_01->v[lVar19] = (uint)psStack_578 & 0x3fffffff;
    psStack_578 = (secp256k1_modinv32_signed30 *)((long)psStack_578 >> 0x1e);
    lVar19 = lVar19 + 1;
  } while (lVar19 != 8);
  if (8 < extraout_EDX) {
    psStack_578 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_578->v + (long)psVar44->v[8] * (long)iVar24);
  }
  b = (secp256k1_modinv32_signed30 *)(long)(int)psStack_578;
  if (b == psStack_578) {
    a_01->v[8] = (int)psStack_578;
    return;
  }
  pcStack_580 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar14 = *extraout_RDX_00;
  psVar64 = (secp256k1_modinv32_signed30 *)(long)(int)uVar14;
  uVar57 = extraout_RDX_00[1];
  lVar19 = (long)(int)uVar57;
  uVar39 = extraout_RDX_00[2];
  psVar33 = (secp256k1_modinv32_signed30 *)(long)(int)uVar39;
  lStack_5b8 = (long)(int)extraout_RDX_00[3];
  psVar45 = (secp256k1_fe *)0x9;
  pcStack_5c8 = (code *)0x155ac5;
  a_02 = a_01;
  piStack_5a8 = piVar32;
  psStack_5a0 = modinfo;
  uStack_598 = uVar29;
  uStack_588 = uVar52;
  pcStack_580 = (code *)puVar38;
  iVar15 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar15 < 1) {
    pcStack_5c8 = (code *)0x155d2d;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_00155d2d:
    pcStack_5c8 = (code *)0x155d32;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_00155d32:
    pcStack_5c8 = (code *)0x155d37;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_00155d37:
    pcStack_5c8 = (code *)0x155d3c;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_00155d3c:
    pcStack_5c8 = (code *)0x155d41;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_00155d41:
    pcStack_5c8 = (code *)0x155d46;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_00155d46:
    pcStack_5c8 = (code *)0x155d4b;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_00155d4b:
    pcStack_5c8 = (code *)0x155d50;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar62 = b;
LAB_00155d50:
    pcStack_5c8 = (code *)0x155d55;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_00155d55:
    pcStack_5c8 = (code *)0x155d5a;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_00155d5a:
    pcStack_5c8 = (code *)0x155d5f;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_5c8 = (code *)0x155ae2;
    a_02 = a_01;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar15) goto LAB_00155d2d;
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_5c8 = (code *)0x155aff;
    a_02 = psVar44;
    iVar15 = secp256k1_modinv32_mul_cmp_30(psVar44,9,b,-2);
    if (iVar15 < 1) goto LAB_00155d32;
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_5c8 = (code *)0x155b1c;
    a_02 = psVar44;
    iVar15 = secp256k1_modinv32_mul_cmp_30(psVar44,9,b,1);
    if (-1 < iVar15) goto LAB_00155d37;
    psVar62 = (secp256k1_modinv32_signed30 *)-(long)psVar64;
    if (0 < (long)psVar64) {
      psVar62 = psVar64;
    }
    lVar25 = -lVar19;
    if (lVar19 < 1) {
      lVar25 = lVar19;
    }
    if (lVar25 + 0x40000000 < (long)psVar62) goto LAB_00155d3c;
    psVar62 = (secp256k1_modinv32_signed30 *)-(long)psVar33;
    if (0 < (long)psVar33) {
      psVar62 = psVar33;
    }
    lVar25 = -lStack_5b8;
    if (lStack_5b8 < 1) {
      lVar25 = lStack_5b8;
    }
    if (lVar25 + 0x40000000 < (long)psVar62) goto LAB_00155d41;
    uVar28 = a_01->v[8] >> 0x1f;
    uVar16 = psVar44->v[8] >> 0x1f;
    psVar45 = (secp256k1_fe *)(ulong)uVar16;
    iVar15 = (uVar16 & uVar57) + (uVar28 & uVar14);
    a_02 = (secp256k1_modinv32_signed30 *)
           (psVar44->v[0] * lVar19 + (long)a_01->v[0] * (long)psVar64);
    lVar25 = (long)(int)(iVar15 - ((int)a_02 * b[1].v[0] + iVar15 & 0x3fffffffU));
    piVar27 = (int32_t *)((long)a_02->v + lVar25 * b->v[0]);
    if (((ulong)piVar27 & 0x3fffffff) != 0) goto LAB_00155d46;
    lStack_5b0 = lVar25;
    iVar15 = (uVar16 & (uint)lStack_5b8) + (uVar28 & uVar39);
    lVar26 = psVar44->v[0] * lStack_5b8 + (long)a_01->v[0] * (long)psVar33;
    a_02 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar14 = iVar15 - (b[1].v[0] * (int)lVar26 + iVar15 & 0x3fffffffU);
    psVar45 = (secp256k1_fe *)(ulong)uVar14;
    uVar52 = (long)b->v[0] * (long)(int)uVar14 + lVar26;
    if ((uVar52 & 0x3fffffff) != 0) goto LAB_00155d4b;
    lVar26 = (long)uVar52 >> 0x1e;
    lVar43 = (long)piVar27 >> 0x1e;
    lVar49 = 1;
    do {
      lVar43 = b->v[lVar49] * lVar25 + psVar44->v[lVar49] * lVar19 +
               (long)a_01->v[lVar49] * (long)psVar64 + lVar43;
      psVar62 = (secp256k1_modinv32_signed30 *)(psVar44->v[lVar49] * lStack_5b8);
      lVar26 = (long)psVar62->v +
               (long)a_01->v[lVar49] * (long)psVar33 + lVar26 +
               (long)b->v[lVar49] * (long)(int)uVar14;
      a_01->v[lVar49 + -1] = (uint)lVar43 & 0x3fffffff;
      psVar44->v[lVar49 + -1] = (uint)lVar26 & 0x3fffffff;
      lVar49 = lVar49 + 1;
      lVar26 = lVar26 >> 0x1e;
      lVar43 = lVar43 >> 0x1e;
    } while (lVar49 != 9);
    a_01->v[8] = (int32_t)lVar43;
    psVar44->v[8] = (int32_t)lVar26;
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_5c8 = (code *)0x155cc6;
    a_02 = a_01;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
    psVar33 = psVar44;
    psVar64 = b;
    if (iVar15 < 1) goto LAB_00155d50;
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_5c8 = (code *)0x155ce3;
    a_02 = a_01;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar15) goto LAB_00155d55;
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_5c8 = (code *)0x155cfc;
    a_02 = psVar44;
    iVar15 = secp256k1_modinv32_mul_cmp_30(psVar44,9,b,-2);
    if (iVar15 < 1) goto LAB_00155d5a;
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_5c8 = (code *)0x155d15;
    a_02 = psVar44;
    iVar15 = secp256k1_modinv32_mul_cmp_30(psVar44,9,b,1);
    if (iVar15 < 0) {
      return;
    }
  }
  pcStack_5c8 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_5c8 = (code *)lVar19;
  psStack_5d0 = a_01;
  psStack_5d8 = psVar44;
  psStack_5e0 = psVar64;
  psStack_5e8 = psVar62;
  psStack_5f0 = psVar33;
  uVar14 = a_02->v[0];
  uVar50 = (ulong)uVar14;
  uVar57 = a_02->v[3];
  uVar20 = (ulong)uVar57;
  uVar39 = a_02->v[4];
  uVar54 = (ulong)uVar39;
  uVar16 = a_02->v[5];
  uVar29 = (ulong)uVar16;
  psVar44 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_02->v[6];
  uVar28 = a_02->v[7];
  uVar52 = (ulong)uVar28;
  iStack_5f4 = a_02->v[8];
  lVar19 = 0;
  do {
    if (a_02->v[lVar19] < -0x3fffffff) {
      pcStack_630 = (code *)0x1560ad;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_001560ad:
      pcStack_630 = (code *)0x1560b2;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_001560b2;
    }
    if (0x3fffffff < a_02->v[lVar19]) goto LAB_001560ad;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 9);
  uStack_614 = (uint)psVar45;
  psVar45 = (secp256k1_fe *)0x9;
  pcStack_630 = (code *)0x155dea;
  psVar44 = a_02;
  uStack_620 = a_02->v[1];
  uStack_61c = a_02->v[2];
  uStack_618 = a_02->v[6];
  psStack_610 = b_00;
  iVar15 = secp256k1_modinv32_mul_cmp_30(a_02,9,b_00,-2);
  if (iVar15 < 1) {
LAB_001560b2:
    pcStack_630 = (code *)0x1560b7;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_001560b7:
    pcStack_630 = (code *)0x1560bc;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_001560bc:
    pcStack_630 = (code *)0x1560c1;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_001560c1:
    pcStack_630 = (code *)0x1560c6;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_630 = (code *)0x155e09;
    psVar44 = a_02;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_610,1);
    if (-1 < iVar15) goto LAB_001560b7;
    uVar40 = iStack_5f4 >> 0x1f;
    uStack_5f8 = psStack_610->v[1];
    uVar22 = (uVar40 & uStack_5f8) + uStack_620;
    uStack_620 = psStack_610->v[2];
    uVar53 = (uVar40 & uStack_620) + uStack_61c;
    uStack_61c = psStack_610->v[3];
    uStack_5fc = psStack_610->v[4];
    uStack_600 = psStack_610->v[5];
    uStack_604 = psStack_610->v[6];
    uVar63 = (uVar40 & uStack_604) + uStack_618;
    uStack_618 = psStack_610->v[7];
    uStack_624 = (int)uStack_614 >> 0x1f;
    uStack_614 = psStack_610->v[8];
    uVar58 = ((uVar40 & psStack_610->v[0]) + uVar14 ^ uStack_624) - uStack_624;
    uVar35 = ((int)uVar58 >> 0x1e) + ((uVar22 ^ uStack_624) - uStack_624);
    uVar22 = ((int)uVar35 >> 0x1e) + ((uVar53 ^ uStack_624) - uStack_624);
    uVar65 = ((int)uVar22 >> 0x1e) + (((uVar40 & uStack_61c) + uVar57 ^ uStack_624) - uStack_624);
    uVar57 = ((int)uVar65 >> 0x1e) + (((uVar40 & uStack_5fc) + uVar39 ^ uStack_624) - uStack_624);
    uVar14 = ((int)uVar57 >> 0x1e) + (((uVar40 & uStack_600) + uVar16 ^ uStack_624) - uStack_624);
    uVar39 = ((int)uVar14 >> 0x1e) + ((uVar63 ^ uStack_624) - uStack_624);
    uVar16 = ((int)uVar39 >> 0x1e) + (((uVar40 & uStack_618) + uVar28 ^ uStack_624) - uStack_624);
    uVar36 = ((int)uVar16 >> 0x1e) +
             (((uVar40 & uStack_614) + iStack_5f4 ^ uStack_624) - uStack_624);
    uVar29 = (ulong)uVar36;
    uStack_628 = (int)uVar36 >> 0x1f;
    uVar63 = (psStack_610->v[0] & uStack_628) + (uVar58 & 0x3fffffff);
    uVar53 = (uStack_600 & uStack_628) + (uVar14 & 0x3fffffff);
    uVar50 = (ulong)uVar53;
    uVar58 = (uStack_604 & uStack_628) + (uVar39 & 0x3fffffff);
    uVar20 = (ulong)uVar58;
    uVar14 = ((int)uVar63 >> 0x1e) + (uStack_5f8 & uStack_628) + (uVar35 & 0x3fffffff);
    uVar39 = ((int)uVar14 >> 0x1e) + (uStack_620 & uStack_628) + (uVar22 & 0x3fffffff);
    uVar28 = ((int)uVar39 >> 0x1e) + (uStack_61c & uStack_628) + (uVar65 & 0x3fffffff);
    uVar40 = ((int)uVar28 >> 0x1e) + (uStack_5fc & uStack_628) + (uVar57 & 0x3fffffff);
    uVar53 = ((int)uVar40 >> 0x1e) + uVar53;
    uVar58 = ((int)uVar53 >> 0x1e) + uVar58;
    uVar57 = ((int)uVar58 >> 0x1e) + (uStack_618 & uStack_628) + (uVar16 & 0x3fffffff);
    uVar16 = ((int)uVar57 >> 0x1e) + (uStack_614 & uStack_628) + uVar36;
    uVar54 = (ulong)uVar16;
    uVar28 = uVar28 & 0x3fffffff;
    psVar45 = (secp256k1_fe *)(ulong)uVar28;
    uVar40 = uVar40 & 0x3fffffff;
    psVar44 = (secp256k1_modinv32_signed30 *)(ulong)uVar40;
    uVar57 = uVar57 & 0x3fffffff;
    uVar52 = (ulong)uVar57;
    a_02->v[0] = uVar63 & 0x3fffffff;
    a_02->v[1] = uVar14 & 0x3fffffff;
    a_02->v[2] = uVar39 & 0x3fffffff;
    a_02->v[3] = uVar28;
    a_02->v[4] = uVar40;
    a_02->v[5] = uVar53 & 0x3fffffff;
    a_02->v[6] = uVar58 & 0x3fffffff;
    a_02->v[7] = uVar57;
    a_02->v[8] = uVar16;
    if (0x3fffffff < uVar16) goto LAB_001560bc;
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_630 = (code *)0x15607a;
    psVar44 = a_02;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_610,0);
    if (iVar15 < 0) goto LAB_001560c1;
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_630 = (code *)0x156095;
    psVar44 = a_02;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_610,1);
    if (iVar15 < 0) {
      return;
    }
  }
  pcStack_630 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  r = &sStack_6f0;
  psVar34 = &sStack_6f0;
  pcVar30 = secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    pcVar30 = secp256k1_fe_inv;
  }
  pcStack_6f8 = (code *)0x1560fc;
  uStack_658 = uVar52;
  uStack_650 = uVar29;
  uStack_648 = uVar20;
  psStack_640 = a_02;
  uStack_638 = uVar50;
  pcStack_630 = (code *)uVar54;
  (*pcVar30)(&sStack_6f0);
  if (psVar44 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar44->v + 8) = sStack_6f0.n[4];
    *(ulong *)(psVar44[1].v + 1) = CONCAT44(sStack_6f0.normalized,sStack_6f0.magnitude);
    *(uint64_t *)(psVar44->v + 4) = sStack_6f0.n[2];
    *(uint64_t *)(psVar44->v + 6) = sStack_6f0.n[3];
    *(uint64_t *)psVar44->v = sStack_6f0.n[0];
    *(uint64_t *)(psVar44->v + 2) = sStack_6f0.n[1];
  }
  uVar54 = 0xffffffffffff;
  sStack_690.n[0] = psVar45->n[0];
  sStack_690.n[1] = psVar45->n[1];
  sStack_690.n[2] = psVar45->n[2];
  sStack_690.n[3] = psVar45->n[3];
  sStack_690.n[4] = psVar45->n[4];
  sStack_690.magnitude = psVar45->magnitude;
  sStack_690.normalized = psVar45->normalized;
  psVar46 = &sStack_690;
  pcStack_6f8 = (code *)0x156165;
  secp256k1_fe_verify(psVar46);
  uVar52 = (sStack_690.n[4] >> 0x30) * 0x1000003d1 + sStack_690.n[0];
  if (((uVar52 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar52 & 0xfffffffffffff) == 0)) {
    uVar29 = (uVar52 >> 0x34) + sStack_690.n[1];
    uVar20 = (uVar29 >> 0x34) + sStack_690.n[2];
    uVar50 = (uVar20 >> 0x34) + sStack_690.n[3];
    uVar51 = (uVar50 >> 0x34) + (sStack_690.n[4] & 0xffffffffffff);
    if ((((uVar29 | uVar52 | uVar20 | uVar50) & 0xfffffffffffff) != 0 || uVar51 != 0) &&
       (((uVar52 | 0x1000003d0) & uVar29 & uVar20 & uVar50 & (uVar51 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0015620c;
LAB_001565d6:
    pcStack_6f8 = (code *)0x1565e1;
    secp256k1_fe_verify(&sStack_6f0);
    uVar54 = sStack_6f0.n[4] & 0xffffffffffff;
    uVar52 = (sStack_6f0.n[4] >> 0x30) * 0x1000003d1 + sStack_6f0.n[0];
    uVar29 = (uVar52 >> 0x34) + sStack_6f0.n[1];
    uVar20 = (uVar29 >> 0x34) + sStack_6f0.n[2];
    r = (secp256k1_fe *)((uVar20 >> 0x34) + sStack_6f0.n[3]);
    uVar50 = ((ulong)r >> 0x34) + uVar54;
    if ((((uVar29 | uVar52 | uVar20 | (ulong)r) & 0xfffffffffffff) == 0 && uVar50 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar50 ^ 0xf000000000000), psVar34 = &sStack_6f0,
       ((uVar52 ^ 0x1000003d0) & uVar29 & uVar20 & (ulong)r & (ulong)r_00) == 0xfffffffffffff)) {
      return;
    }
  }
  else {
LAB_0015620c:
    pcStack_6f8 = (code *)0x15621f;
    psVar46 = psVar45;
    secp256k1_fe_mul(&sStack_690,psVar45,&sStack_6f0);
    pcStack_6f8 = (code *)0x156227;
    secp256k1_fe_verify(&sStack_690);
    r_00 = &fe_minus_one;
    pcStack_6f8 = (code *)0x156233;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_690.magnitude < 0x20) {
      sStack_690.n[0] = sStack_690.n[0] + 0xffffefffffc2e;
      sStack_690.n[1] = sStack_690.n[1] + 0xfffffffffffff;
      sStack_690.n[2] = sStack_690.n[2] + 0xfffffffffffff;
      sStack_690.n[3] = sStack_690.n[3] + 0xfffffffffffff;
      sStack_690.n[4] = sStack_690.n[4] + 0xffffffffffff;
      sStack_690.normalized = 0;
      sStack_690.magnitude = sStack_690.magnitude + 1;
      pcStack_6f8 = (code *)0x156285;
      secp256k1_fe_verify(&sStack_690);
      pcStack_6f8 = (code *)0x15628d;
      secp256k1_fe_verify(&sStack_690);
      uVar52 = (sStack_690.n[4] >> 0x30) * 0x1000003d1 + sStack_690.n[0];
      uVar29 = (uVar52 >> 0x34) + sStack_690.n[1];
      uVar20 = (uVar29 >> 0x34) + sStack_690.n[2];
      psVar46 = (secp256k1_fe *)((uVar20 >> 0x34) + sStack_690.n[3]);
      uVar50 = ((ulong)psVar46 >> 0x34) + (sStack_690.n[4] & 0xffffffffffff);
      if ((((uVar29 | uVar52 | uVar20 | (ulong)psVar46) & 0xfffffffffffff) != 0 || uVar50 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar50 ^ 0xf000000000000),
         ((uVar52 ^ 0x1000003d0) & uVar29 & uVar20 & (ulong)psVar46 & (ulong)r_00) !=
         0xfffffffffffff)) goto LAB_00156674;
      sStack_6c0.n[0] = psVar45->n[0];
      sStack_6c0.n[1] = psVar45->n[1];
      sStack_6c0.n[2] = psVar45->n[2];
      sStack_6c0.n[3] = psVar45->n[3];
      sStack_6c0.n[4] = psVar45->n[4];
      sStack_6c0.magnitude = psVar45->magnitude;
      sStack_6c0.normalized = psVar45->normalized;
      psVar45 = &sStack_6c0;
      pcStack_6f8 = (code *)0x156333;
      secp256k1_fe_verify(psVar45);
      r_00 = &fe_minus_one;
      pcStack_6f8 = (code *)0x15633f;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_6c0.magnitude) goto LAB_00156679;
      sStack_6c0.n[0] = sStack_6c0.n[0] + 0xffffefffffc2e;
      sStack_6c0.n[1] = sStack_6c0.n[1] + 0xfffffffffffff;
      sStack_6c0.n[2] = sStack_6c0.n[2] + 0xfffffffffffff;
      sStack_6c0.n[3] = sStack_6c0.n[3] + 0xfffffffffffff;
      sStack_6c0.n[4] = sStack_6c0.n[4] + 0xffffffffffff;
      sStack_6c0.normalized = 0;
      sStack_6c0.magnitude = sStack_6c0.magnitude + 1;
      pcStack_6f8 = (code *)0x15638a;
      secp256k1_fe_verify(&sStack_6c0);
      pcStack_6f8 = (code *)0x156392;
      secp256k1_fe_verify(&sStack_6c0);
      uVar52 = (sStack_6c0.n[4] >> 0x30) * 0x1000003d1 + sStack_6c0.n[0];
      if (((uVar52 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar52 & 0xfffffffffffff) == 0)) {
        uVar29 = (uVar52 >> 0x34) + sStack_6c0.n[1];
        uVar20 = (uVar29 >> 0x34) + sStack_6c0.n[2];
        uVar50 = (uVar20 >> 0x34) + sStack_6c0.n[3];
        uVar51 = (uVar50 >> 0x34) + (sStack_6c0.n[4] & 0xffffffffffff);
        if (((uVar29 | uVar52 | uVar20 | uVar50) & 0xfffffffffffff) == 0 && uVar51 == 0) {
          return;
        }
        if (((uVar52 | 0x1000003d0) & uVar29 & uVar20 & uVar50 & (uVar51 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      psVar46 = &sStack_6c0;
      pcStack_6f8 = (code *)0x156441;
      (*pcVar30)();
      pcStack_6f8 = (code *)0x15644c;
      secp256k1_fe_verify(&sStack_6f0);
      r_00 = &fe_minus_one;
      pcStack_6f8 = (code *)0x156458;
      secp256k1_fe_verify(&fe_minus_one);
      psVar45 = &sStack_6f0;
      if (0x1f < sStack_6f0.magnitude) goto LAB_0015667e;
      sStack_6f0.n[0] = sStack_6f0.n[0] + 0xffffefffffc2e;
      sStack_6f0.n[1] = sStack_6f0.n[1] + 0xfffffffffffff;
      sStack_6f0.n[2] = sStack_6f0.n[2] + 0xfffffffffffff;
      sStack_6f0.n[3] = sStack_6f0.n[3] + 0xfffffffffffff;
      sStack_6f0.n[4] = sStack_6f0.n[4] + 0xffffffffffff;
      sStack_6f0.magnitude = sStack_6f0.magnitude + 1;
      sStack_6f0.normalized = 0;
      pcStack_6f8 = (code *)0x1564a1;
      secp256k1_fe_verify(&sStack_6f0);
      pcStack_6f8 = (code *)0x1564aa;
      (*pcVar30)(&sStack_6f0);
      pcStack_6f8 = (code *)0x1564b2;
      secp256k1_fe_verify(&sStack_6f0);
      sStack_6f0.n[0] = sStack_6f0.n[0] + 1;
      sStack_6f0.magnitude = sStack_6f0.magnitude + 1;
      sStack_6f0.normalized = 0;
      pcStack_6f8 = (code *)0x1564c4;
      secp256k1_fe_verify(&sStack_6f0);
      pcStack_6f8 = (code *)0x1564cc;
      secp256k1_fe_verify(&sStack_6f0);
      psVar46 = &sStack_6c0;
      pcStack_6f8 = (code *)0x1564d9;
      r_00 = psVar46;
      secp256k1_fe_verify(psVar46);
      if (sStack_6c0.magnitude + sStack_6f0.magnitude < 0x21) {
        sStack_6f0.n[0] = sStack_6f0.n[0] + sStack_6c0.n[0];
        sStack_6f0.n[1] = sStack_6f0.n[1] + sStack_6c0.n[1];
        sStack_6f0.n[2] = sStack_6f0.n[2] + sStack_6c0.n[2];
        sStack_6f0.n[3] = sStack_6f0.n[3] + sStack_6c0.n[3];
        sStack_6f0.n[4] = sStack_6f0.n[4] + sStack_6c0.n[4];
        sStack_6f0.normalized = 0;
        pcStack_6f8 = (code *)0x156525;
        sStack_6f0.magnitude = sStack_6c0.magnitude + sStack_6f0.magnitude;
        secp256k1_fe_verify(&sStack_6f0);
        pcStack_6f8 = (code *)0x15652d;
        secp256k1_fe_verify(&sStack_6f0);
        uVar52 = (sStack_6f0.n[4] >> 0x30) * 0x1000003d1 + sStack_6f0.n[0];
        if (((uVar52 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar52 & 0xfffffffffffff) == 0)) {
          uVar54 = (uVar52 >> 0x34) + sStack_6f0.n[1];
          uVar29 = (uVar54 >> 0x34) + sStack_6f0.n[2];
          uVar20 = (uVar29 >> 0x34) + sStack_6f0.n[3];
          uVar50 = (uVar20 >> 0x34) + (sStack_6f0.n[4] & 0xffffffffffff);
          if (((uVar54 | uVar52 | uVar29 | uVar20) & 0xfffffffffffff) == 0 && uVar50 == 0) {
            return;
          }
          if (((uVar52 | 0x1000003d0) & uVar54 & uVar29 & uVar20 & (uVar50 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_6f8 = (code *)0x1565d6;
        test_inverse_field_cold_2();
        goto LAB_001565d6;
      }
    }
    else {
      pcStack_6f8 = (code *)0x156674;
      test_inverse_field_cold_7();
LAB_00156674:
      pcStack_6f8 = (code *)0x156679;
      test_inverse_field_cold_6();
LAB_00156679:
      pcStack_6f8 = (code *)0x15667e;
      test_inverse_field_cold_5();
LAB_0015667e:
      r = psVar46;
      psVar34 = psVar45;
      psVar46 = &sStack_690;
      pcStack_6f8 = (code *)0x156683;
      test_inverse_field_cold_4();
    }
    pcStack_6f8 = (code *)0x156688;
    test_inverse_field_cold_3();
  }
  pcStack_6f8 = test_inverse_scalar;
  test_inverse_field_cold_1();
  pcStack_6f8 = (code *)0xfffffffffffff;
  psVar45 = (secp256k1_fe *)auStack_768;
  pcVar68 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar68 = secp256k1_scalar_inverse;
  }
  pcStack_770 = (code *)0x1566b6;
  auStack_728._32_8_ = psVar34;
  auStack_728._40_8_ = psVar46;
  (*pcVar68)(auStack_768);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_768._20_4_,auStack_768._16_4_);
    r_00->n[3] = CONCAT44(auStack_768._28_4_,auStack_768._24_4_);
    r_00->n[0] = CONCAT44(auStack_768._4_4_,auStack_768._0_4_);
    r_00->n[1] = CONCAT44(auStack_768._12_4_,auStack_768._8_4_);
  }
  pcStack_770 = (code *)0x1566d5;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar70._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar70._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar70._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar70._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar15 = movmskps(extraout_EAX,auVar70);
  if (iVar15 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_728;
    pcStack_770 = (code *)0x156709;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_768);
    pcStack_770 = (code *)0x156711;
    psVar34 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_728._0_8_ != 1 || auStack_728._8_8_ != 0) || auStack_728._16_8_ != 0) ||
        auStack_728._24_8_ != 0) {
      pcStack_770 = (code *)0x15681b;
      test_inverse_scalar_cold_1();
      goto LAB_0015681b;
    }
    pcStack_770 = (code *)0x156741;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_768 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_770 = (code *)0x156749;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_768 + 0x20));
    auVar71._0_4_ = -(uint)(iStack_738 == 0 && auStack_768._32_4_ == 0);
    auVar71._4_4_ = -(uint)(iStack_734 == 0 && iStack_744 == 0);
    auVar71._8_4_ = -(uint)(iStack_730 == 0 && iStack_740 == 0);
    auVar71._12_4_ = -(uint)(iStack_72c == 0 && iStack_73c == 0);
    iVar15 = movmskps(extraout_EAX_00,auVar71);
    if (iVar15 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_768 + 0x20);
    pcStack_770 = (code *)0x15677a;
    (*pcVar68)(a,a);
    pcStack_770 = (code *)0x15678f;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_768,&scalar_minus_one,(secp256k1_scalar *)auStack_768);
    pcStack_770 = (code *)0x156798;
    (*pcVar68)(auStack_768,auStack_768);
    pcStack_770 = (code *)0x1567aa;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_768,(secp256k1_scalar *)auStack_768,&secp256k1_scalar_one
              );
    pcStack_770 = (code *)0x1567b8;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_768,a,(secp256k1_scalar *)auStack_768);
    pcStack_770 = (code *)0x1567c0;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_768);
    auVar72._0_4_ = -(uint)(auStack_768._16_4_ == 0 && auStack_768._0_4_ == 0);
    auVar72._4_4_ = -(uint)(auStack_768._20_4_ == 0 && auStack_768._4_4_ == 0);
    auVar72._8_4_ = -(uint)(auStack_768._24_4_ == 0 && auStack_768._8_4_ == 0);
    auVar72._12_4_ = -(uint)(auStack_768._28_4_ == 0 && auStack_768._12_4_ == 0);
    iVar15 = movmskps(extraout_EAX_01,auVar72);
    if (iVar15 == 0xf) {
      return;
    }
    pcStack_770 = (code *)0x1567e4;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_768;
  }
  pcStack_770 = (code *)0x1567ef;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_768);
  auVar73._0_4_ = -(uint)(auStack_768._16_4_ == 0 && auStack_768._0_4_ == 0);
  auVar73._4_4_ = -(uint)(auStack_768._20_4_ == 0 && auStack_768._4_4_ == 0);
  auVar73._8_4_ = -(uint)(auStack_768._24_4_ == 0 && auStack_768._8_4_ == 0);
  auVar73._12_4_ = -(uint)(auStack_768._28_4_ == 0 && auStack_768._12_4_ == 0);
  iVar15 = movmskps(extraout_EAX_02,auVar73);
  r = (secp256k1_fe *)auStack_768;
  psVar34 = psVar45;
  if (iVar15 == 0xf) {
    return;
  }
LAB_0015681b:
  pcStack_770 = test_hsort;
  test_inverse_scalar_cold_3();
  uStack_788 = 0x1000003d1;
  __s = auStack_1820;
  psStack_798 = r;
  pcStack_790 = pcVar30;
  psStack_780 = r_00;
  pcStack_778 = pcVar68;
  pcStack_770 = (code *)uVar54;
  memset(__s,0,0x1081);
  uStack_1830 = 0;
  lVar19 = 0x41;
  psStack_1828 = psVar34;
  secp256k1_hsort(__s,0x41,(size_t)psVar34,test_hsort_cmp,&uStack_1830);
  if (0x3f < uStack_1830) {
    test_hsort_is_sorted(auStack_1820,0x41,(size_t)psVar34);
    if (0 < COUNT) {
      iVar15 = 0;
      do {
        uVar17 = testrand_int(0x41);
        count = (size_t)(int)uVar17;
        testrand_bytes_test(auStack_1820,count * (long)psVar34);
        secp256k1_hsort(auStack_1820,count,(size_t)psVar34,test_hsort_cmp,&uStack_1830);
        test_hsort_is_sorted(auStack_1820,count,(size_t)psVar34);
        iVar15 = iVar15 + 1;
      } while (iVar15 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar25 = 0;
    do {
      if (__s[lVar25] != *(uchar *)(lVar19 + lVar25)) {
        return;
      }
      lVar25 = lVar25 + 1;
    } while (extraout_RDX_01[1] != lVar25);
  }
  return;
LAB_00154422:
  pcStack_f0 = (code *)0x154427;
  test_modinv32_uint16_cold_5();
LAB_00154427:
  pcStack_f0 = (code *)0x15442c;
  test_modinv32_uint16_cold_3();
LAB_0015442c:
  pcStack_f0 = (code *)0x154431;
  test_modinv32_uint16_cold_1();
  psVar37 = psVar47;
LAB_00154431:
  psVar67 = psVar37;
  pcStack_f0 = (code *)0x154436;
  test_modinv32_uint16_cold_6();
  goto LAB_00154436;
LAB_001549dc:
  pcStack_1d8 = (code *)0x1549e1;
  test_modinv64_uint16_cold_5();
  goto LAB_001549e1;
}

Assistant:

static void test_modinv32_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    uint16_t tmp[16];
    secp256k1_modinv32_signed30 x;
    secp256k1_modinv32_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed30(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4] | x.v[5] | x.v[6] | x.v[7] | x.v[8]) != 0;
    uint16_to_signed30(&m.modulus, mod);

    /* compute 1/modulus mod 2^30 */
    m.modulus_inv30 = modinv2p64(m.modulus.v[0]) & 0x3fffffff;
    CHECK(((m.modulus_inv30 * m.modulus.v[0]) & 0x3fffffff) == 1);

    /* Test secp256k1_jacobi32_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed30(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed30(&x, sqr);
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed30(&x, in);
    mutate_sign_signed30(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* produce output */
        signed30_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* check if the result is equal to the input */
        signed30_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}